

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_k_ol1.c
# Opt level: O0

void func_fxc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *in_RCX;
  long lVar5;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar120;
  double dVar121;
  double dVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  double dVar170;
  double dVar171;
  double dVar172;
  double dVar173;
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  double dVar184;
  double dVar185;
  double dVar186;
  double dVar187;
  double dVar188;
  double dVar189;
  double dVar190;
  double dVar191;
  double dVar192;
  double dVar193;
  double dVar194;
  double dVar195;
  double dVar196;
  double dVar197;
  double dVar198;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  double dVar272;
  double dVar273;
  double dVar274;
  double dVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  double dVar304;
  double dVar305;
  double dVar306;
  double dVar307;
  double dVar308;
  double dVar309;
  double dVar310;
  double dVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar360;
  double dVar361;
  long *in_stack_00000008;
  double tv2tau20;
  double t3710;
  double t3706;
  double t3696;
  double t3693;
  double t3688;
  double t3685;
  double t3680;
  double t3677;
  double t3676;
  double t3669;
  double t3662;
  double t3658;
  double t3654;
  double t3653;
  double t3649;
  double t3648;
  double t3641;
  double t3636;
  double t3633;
  double t3630;
  double t3626;
  double t3623;
  double t3619;
  double t3618;
  double t3616;
  double t3614;
  double t3612;
  double t3611;
  double t3608;
  double t3605;
  double tv2lapltau0;
  double tv2lapl20;
  double tv2sigmatau0;
  double t3603;
  double t3599;
  double t3594;
  double t3582;
  double t3579;
  double t3574;
  double t3564;
  double t3561;
  double t3560;
  double t3556;
  double t3550;
  double t3548;
  double t3546;
  double t3539;
  double t3537;
  double t3535;
  double t3531;
  double t3525;
  double t3524;
  double t3511;
  double t3508;
  double t3505;
  double t3501;
  double t3498;
  double t3493;
  double t3490;
  double t3483;
  double t3482;
  double t3480;
  double t3478;
  double t3476;
  double t3475;
  double t3471;
  double tv2sigmalapl0;
  double tv2sigma20;
  double t3469;
  double t3465;
  double t3456;
  double t3453;
  double t3445;
  double t3442;
  double t3440;
  double t3437;
  double t3434;
  double t3431;
  double t3424;
  double t3421;
  double t3420;
  double t3419;
  double t3415;
  double t3413;
  double t3411;
  double t3408;
  double t3406;
  double t3404;
  double t3403;
  double t3400;
  double t3399;
  double t3395;
  double t3394;
  double t3393;
  double t3387;
  double t3383;
  double t3380;
  double t3379;
  double t3378;
  double t3377;
  double t3374;
  double t3373;
  double t3364;
  double t3363;
  double t3362;
  double t3358;
  double t3355;
  double t3345;
  double t3339;
  double t3337;
  double t3335;
  double t3333;
  double t3331;
  double t3329;
  double t3317;
  double t3314;
  double t3311;
  double t3305;
  double t3303;
  double t3301;
  double t3299;
  double t3297;
  double t3295;
  double t3294;
  double t3288;
  double t3286;
  double t3284;
  double t3280;
  double t3278;
  double t3276;
  double t3274;
  double t3272;
  double t3270;
  double t3268;
  double t3266;
  double t3264;
  double t3262;
  double t3260;
  double t3258;
  double t3256;
  double t3254;
  double t3252;
  double t3250;
  double t3249;
  double t3248;
  double t3246;
  double t3244;
  double t3242;
  double t3240;
  double t3238;
  double t3236;
  double t3234;
  double t3232;
  double t3230;
  double t3228;
  double t3226;
  double t3224;
  double t3222;
  double t3220;
  double t3218;
  double t3214;
  double t3212;
  double t3211;
  double t3208;
  double t3207;
  double t3204;
  double t3201;
  double t3196;
  double t3195;
  double t3192;
  double t3191;
  double t3187;
  double t3172;
  double t3169;
  double t3166;
  double t3165;
  double t3163;
  double t3160;
  double t3156;
  double t3151;
  double t3148;
  double t3146;
  double t3144;
  double t3142;
  double t3140;
  double t3138;
  double t3136;
  double t3132;
  double t3130;
  double t3128;
  double t3126;
  double t3125;
  double t3123;
  double t3121;
  double t3119;
  double t3117;
  double t3115;
  double t3113;
  double t3111;
  double t3109;
  double t3107;
  double t3105;
  double t3103;
  double t3102;
  double t3100;
  double t3098;
  double t3096;
  double t3094;
  double t3092;
  double t3090;
  double t3088;
  double t3086;
  double t3084;
  double t3082;
  double t3080;
  double t3078;
  double t3077;
  double t3075;
  double t3071;
  double t3069;
  double t3067;
  double t3065;
  double t3063;
  double t3061;
  double t3059;
  double t3057;
  double t3055;
  double t3054;
  double t3051;
  double t3050;
  double t3049;
  double t3043;
  double t3039;
  double t3036;
  double t3025;
  double t3009;
  double t3008;
  double t3003;
  double t3002;
  double t3000;
  double t2998;
  double t2996;
  double t2994;
  double t2992;
  double t2990;
  double t2988;
  double t2986;
  double t2984;
  double t2982;
  double t2980;
  double t2978;
  double t2976;
  double t2974;
  double t2971;
  double t2970;
  double t2966;
  double t2965;
  double t2963;
  double t2961;
  double t2956;
  double t2955;
  double t2952;
  double t2951;
  double t2949;
  double t2946;
  double t2943;
  double t2940;
  double t2934;
  double t2933;
  double t2932;
  double t2931;
  double t2929;
  double t2928;
  double t2927;
  double t2926;
  double t2924;
  double tv2rhotau0;
  double t2921;
  double t2916;
  double t2911;
  double t2906;
  double t2902;
  double t2897;
  double t2894;
  double t2891;
  double t2886;
  double t2876;
  double t2873;
  double t2872;
  double t2863;
  double t2860;
  double t2845;
  double t2844;
  double t2836;
  double t2834;
  double t2833;
  double t2820;
  double t2817;
  double t2816;
  double t2813;
  double t2810;
  double t2808;
  double t2807;
  double t2806;
  double t2803;
  double t2800;
  double t2795;
  double t2792;
  double t2791;
  double t2785;
  double t2783;
  double t2782;
  double t2780;
  double t2778;
  double t2776;
  double t2775;
  double t2771;
  double tv2rholapl0;
  double tv2rhosigma0;
  double t2765;
  double t2760;
  double t2755;
  double t2750;
  double t2747;
  double t2737;
  double t2730;
  double t2727;
  double t2726;
  double t2722;
  double t2719;
  double t2716;
  double t2713;
  double t2705;
  double t2702;
  double t2701;
  double t2692;
  double t2689;
  double t2687;
  double t2684;
  double t2682;
  double t2680;
  double t2678;
  double t2676;
  double t2674;
  double t2673;
  double t2670;
  double t2666;
  double t2665;
  double t2657;
  double t2655;
  double t2654;
  double t2642;
  double t2641;
  double t2636;
  double t2629;
  double t2626;
  double t2625;
  double t2624;
  double t2620;
  double t2617;
  double t2613;
  double t2609;
  double t2606;
  double t2603;
  double t2600;
  double t2598;
  double t2594;
  double t2590;
  double t2586;
  double t2579;
  double t2574;
  double t2571;
  double t2566;
  double t2564;
  double t2559;
  double t2557;
  double t2553;
  double t2549;
  double t2542;
  double t2540;
  double t2537;
  double t2534;
  double t2531;
  double t2528;
  double t2525;
  double t2522;
  double t2519;
  double t2516;
  double t2513;
  double t2510;
  double t2507;
  double t2504;
  double t2501;
  double t2498;
  double t2495;
  double t2492;
  double t2489;
  double t2486;
  double t2485;
  double t2483;
  double t2479;
  double t2477;
  double t2475;
  double t2473;
  double t2471;
  double t2469;
  double t2467;
  double t2465;
  double t2463;
  double t2461;
  double t2459;
  double t2457;
  double t2455;
  double t2453;
  double t2451;
  double t2449;
  double t2448;
  double t2445;
  double t2442;
  double t2439;
  double t2436;
  double t2433;
  double t2428;
  double t2425;
  double t2424;
  double t2421;
  double t2416;
  double t2415;
  double t2410;
  double t2407;
  double t2404;
  double t2403;
  double t2402;
  double t2400;
  double t2396;
  double t2393;
  double t2387;
  double t2384;
  double t2381;
  double t2375;
  double t2374;
  double t2364;
  double t2361;
  double t2360;
  double t2356;
  double t2355;
  double t2353;
  double t2350;
  double t2348;
  double t2345;
  double t2343;
  double t2340;
  double t2338;
  double t2335;
  double t2333;
  double t2330;
  double t2328;
  double t2325;
  double t2323;
  double t2320;
  double t2317;
  double t2314;
  double t2309;
  double t2308;
  double t2304;
  double t2299;
  double t2289;
  double t2286;
  double t2281;
  double t2279;
  double t2278;
  double t2276;
  double t2274;
  double t2272;
  double t2270;
  double t2267;
  double t2264;
  double t2259;
  double t2256;
  double t2253;
  double t2250;
  double t2247;
  double t2244;
  double t2241;
  double t2238;
  double t2235;
  double t2232;
  double t2229;
  double t2226;
  double t2223;
  double t2222;
  double t2219;
  double t2216;
  double t2213;
  double t2210;
  double t2207;
  double t2204;
  double t2201;
  double t2198;
  double t2195;
  double t2192;
  double t2189;
  double t2187;
  double t2185;
  double t2183;
  double t2181;
  double t2179;
  double t2177;
  double t2173;
  double t2171;
  double t2169;
  double t2167;
  double t2165;
  double t2164;
  double t2162;
  double t2160;
  double t2158;
  double t2156;
  double t2154;
  double t2152;
  double t2150;
  double t2148;
  double t2146;
  double t2144;
  double t2142;
  double t2141;
  double t2140;
  double t2135;
  double t2134;
  double t2132;
  double t2125;
  double t2119;
  double t2116;
  double t2115;
  double t2111;
  double t2108;
  double t2105;
  double t2102;
  double t2101;
  double t2100;
  double t2094;
  double t2092;
  double t2091;
  double t2089;
  double t2087;
  double t2085;
  double t2084;
  double t2080;
  double tv2rho20;
  double t2074;
  double t2069;
  double t2064;
  double t2061;
  double t2058;
  double t2053;
  double t2050;
  double t2047;
  double t2034;
  double t2031;
  double t2030;
  double t2027;
  double t2026;
  double t2023;
  double t2022;
  double t2015;
  double t2012;
  double t2011;
  double t2004;
  double t1996;
  double t1993;
  double t1984;
  double t1978;
  double t1977;
  double t1976;
  double t1971;
  double t1970;
  double t1966;
  double t1963;
  double t1952;
  double t1951;
  double t1943;
  double t1935;
  double t1932;
  double t1931;
  double t1930;
  double t1928;
  double t1923;
  double t1922;
  double t1917;
  double t1889;
  double t1888;
  double t1883;
  double t1878;
  double t1876;
  double t1875;
  double t1868;
  double t1864;
  double t1861;
  double t1858;
  double t1855;
  double t1852;
  double t1851;
  double t1848;
  double t1844;
  double t1841;
  double t1830;
  double t1829;
  double t1821;
  double t1813;
  double t1810;
  double t1809;
  double t1808;
  double t1806;
  double t1801;
  double t1800;
  double t1795;
  double t1767;
  double t1764;
  double t1759;
  double t1756;
  double t1755;
  double t1751;
  double t1738;
  double t1737;
  double t1733;
  double t1730;
  double t1729;
  double t1728;
  double t1726;
  double t1724;
  double t1723;
  double t1721;
  double t1718;
  double t1714;
  double t1711;
  double t1708;
  double t1705;
  double t1702;
  double t1680;
  double t1657;
  double t1655;
  double t1632;
  double t1609;
  double t1606;
  double t1603;
  double t1602;
  double t1601;
  double t1597;
  double t1594;
  double t1591;
  double t1589;
  double t1588;
  double t1582;
  double t1576;
  double t1572;
  double t1568;
  double t1560;
  double t1557;
  double t1554;
  double t1553;
  double t1550;
  double t1547;
  double t1546;
  double t1545;
  double t1543;
  double t1541;
  double t1529;
  double t1525;
  double t1524;
  double t1518;
  double t1516;
  double t1485;
  double t1477;
  double t1476;
  double t1439;
  double t1438;
  double t1433;
  double t1429;
  double t1428;
  double t1427;
  double t1422;
  double t1418;
  double t1417;
  double t1413;
  double t1412;
  double t1409;
  double t1408;
  double t1406;
  double t1405;
  double t1402;
  double t1397;
  double t1396;
  double t1393;
  double t1389;
  double t1388;
  double t1387;
  double t1385;
  double t1383;
  double t1381;
  double t1379;
  double t1378;
  double t1377;
  double t1373;
  double t1372;
  double t1371;
  double t1370;
  double t1368;
  double t1365;
  double t1362;
  double t1361;
  double t1358;
  double t1357;
  double t1354;
  double t1353;
  double t1352;
  double t1351;
  double t1350;
  double t1349;
  double t1344;
  double t1342;
  double t1341;
  double t1339;
  double t1337;
  double t1334;
  double t1331;
  double t1330;
  double t1328;
  double t1321;
  double tvtau0;
  double t1318;
  double t1314;
  double t1308;
  double t1305;
  double t1299;
  double t1298;
  double t1293;
  double t1289;
  double t1288;
  double t1287;
  double t1284;
  double t1281;
  double t1280;
  double t1275;
  double t1274;
  double t1273;
  double t1272;
  double t1269;
  double t1267;
  double t1266;
  double t1264;
  double t1262;
  double t1261;
  double t1258;
  double t1257;
  double tvlapl0;
  double tvsigma0;
  double t1255;
  double t1251;
  double t1246;
  double t1237;
  double t1231;
  double t1230;
  double t1225;
  double t1223;
  double t1221;
  double t1220;
  double t1218;
  double t1217;
  double t1214;
  double t1213;
  double t1210;
  double t1209;
  double t1205;
  double t1202;
  double t1201;
  double t1198;
  double t1195;
  double t1194;
  double t1193;
  double t1189;
  double t1183;
  double t1180;
  double t1178;
  double t1176;
  double t1174;
  double t1169;
  double t1167;
  double t1163;
  double t1161;
  double t1159;
  double t1156;
  double t1155;
  double t1153;
  double t1151;
  double t1149;
  double t1147;
  double t1145;
  double t1143;
  double t1141;
  double t1139;
  double t1137;
  double t1135;
  double t1133;
  double t1131;
  double t1129;
  double t1127;
  double t1125;
  double t1123;
  double t1121;
  double t1118;
  double t1115;
  double t1112;
  double t1111;
  double t1108;
  double t1107;
  double t1103;
  double t1094;
  double t1092;
  double t1091;
  double t1088;
  double t1085;
  double t1083;
  double t1081;
  double t1079;
  double t1077;
  double t1075;
  double t1073;
  double t1071;
  double t1069;
  double t1067;
  double t1065;
  double t1063;
  double t1061;
  double t1060;
  double t1058;
  double t1056;
  double t1054;
  double t1052;
  double t1050;
  double t1048;
  double t1046;
  double t1044;
  double t1040;
  double t1038;
  double t1037;
  double t1033;
  double t1029;
  double t1026;
  double t1014;
  double t1011;
  double t1009;
  double t1007;
  double t1005;
  double t1003;
  double t1001;
  double t999;
  double t996;
  double t995;
  double t991;
  double t990;
  double t988;
  double t986;
  double t981;
  double t979;
  double t978;
  double t976;
  double t974;
  double t973;
  double tvrho0;
  double t968;
  double t963;
  double t960;
  double t957;
  double t954;
  double t951;
  double t940;
  double t939;
  double t933;
  double t932;
  double t924;
  double t921;
  double t910;
  double t909;
  double t908;
  double t907;
  double t906;
  double t904;
  double t903;
  double t899;
  double t896;
  double t891;
  double t887;
  double t886;
  double t882;
  double t880;
  double t876;
  double t872;
  double t868;
  double t864;
  double t860;
  double t856;
  double t855;
  double t852;
  double t851;
  double t848;
  double t847;
  double t844;
  double t843;
  double t841;
  double t840;
  double t836;
  double t833;
  double t832;
  double t831;
  double t830;
  double t829;
  double t826;
  double t822;
  double t821;
  double t820;
  double t816;
  double t813;
  double t812;
  double t808;
  double t805;
  double t803;
  double t801;
  double t799;
  double t796;
  double t793;
  double t792;
  double t791;
  double t789;
  double t783;
  double t781;
  double t778;
  double t777;
  double t774;
  double t770;
  double t766;
  double t762;
  double t758;
  double t754;
  double t750;
  double t746;
  double t742;
  double t738;
  double t734;
  double t730;
  double t726;
  double t725;
  double t722;
  double t721;
  double t718;
  double t717;
  double t714;
  double t713;
  double t710;
  double t709;
  double t708;
  double t705;
  double t704;
  double t703;
  double t700;
  double t699;
  double t698;
  double t696;
  double t693;
  double t692;
  double t690;
  double t689;
  double t686;
  double t685;
  double t681;
  double t678;
  double t671;
  double t670;
  double t669;
  double t667;
  double t666;
  double t664;
  double t662;
  double t659;
  double t658;
  double t656;
  double t653;
  double t649;
  double t645;
  double t641;
  double t637;
  double t633;
  double t629;
  double t625;
  double t621;
  double t617;
  double t613;
  double t611;
  double t608;
  double t604;
  double t600;
  double t599;
  double t596;
  double t593;
  double t590;
  double t589;
  double t586;
  double t585;
  double t582;
  double t579;
  double t576;
  double t574;
  double t573;
  double t572;
  double t569;
  double t568;
  double t566;
  double t565;
  double t562;
  double t561;
  double t558;
  double t554;
  double t551;
  double t546;
  double t542;
  double t541;
  double t537;
  double t535;
  double t531;
  double t527;
  double t523;
  double t519;
  double t515;
  double t511;
  double t510;
  double t507;
  double t506;
  double t503;
  double t502;
  double t497;
  double t496;
  double t494;
  double t492;
  double t490;
  double t488;
  double t487;
  double t486;
  double t484;
  double t483;
  double t482;
  double t480;
  double t479;
  double t475;
  double t474;
  double t472;
  double t471;
  double t468;
  double t467;
  double t466;
  double t465;
  double t462;
  double t461;
  double t459;
  double t457;
  double t456;
  double t453;
  double t452;
  double t448;
  double tzk0;
  double t446;
  double t442;
  double t439;
  double t436;
  double t425;
  double t424;
  double t421;
  double t420;
  double t418;
  double t417;
  double t408;
  double t407;
  double t404;
  double t403;
  double t399;
  double t396;
  double t393;
  double t392;
  double t390;
  double t389;
  double t387;
  double t385;
  double t384;
  double t381;
  double t380;
  double t378;
  double t375;
  double t372;
  double t369;
  double t368;
  double t366;
  double t365;
  double t363;
  double t362;
  double t359;
  double t358;
  double t357;
  double t356;
  double t355;
  double t352;
  double t350;
  double t347;
  double t345;
  double t344;
  double t343;
  double t339;
  double t336;
  double t334;
  double t332;
  double t328;
  double t326;
  double t322;
  double t320;
  double t319;
  double t317;
  double t316;
  double t314;
  double t312;
  double t311;
  double t309;
  double t308;
  double t306;
  double t305;
  double t303;
  double t300;
  double t297;
  double t294;
  double t293;
  double t291;
  double t288;
  double t285;
  double t282;
  double t279;
  double t276;
  double t273;
  double t270;
  double t269;
  double t267;
  double t266;
  double t264;
  double t263;
  double t261;
  double t260;
  double t258;
  double t257;
  double t255;
  double t254;
  double t251;
  double t250;
  double t249;
  double t248;
  double t247;
  double t244;
  double t243;
  double t242;
  double t241;
  double t240;
  double t237;
  double t236;
  double t235;
  double t234;
  double t232;
  double t231;
  double t227;
  double t224;
  double t222;
  double t218;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t208;
  double t206;
  double t203;
  double t200;
  double t197;
  double t194;
  double t191;
  double t189;
  double t186;
  double t183;
  double t180;
  double t177;
  double t175;
  double t173;
  double t170;
  double t169;
  double t167;
  double t165;
  double t163;
  double t161;
  double t160;
  double t158;
  double t156;
  double t152;
  double t150;
  double t149;
  double t147;
  double t145;
  double t144;
  double t143;
  double t142;
  double t141;
  double t140;
  double t139;
  double t138;
  double t137;
  double t135;
  double t134;
  double t133;
  double t129;
  double t126;
  double t123;
  double t122;
  double t120;
  double t119;
  double t117;
  double t115;
  double t114;
  double t113;
  double t110;
  double t109;
  double t107;
  double t104;
  double t101;
  double t98;
  double t97;
  double t95;
  double t94;
  double t92;
  double t91;
  double t88;
  double t87;
  double t86;
  double t85;
  double t84;
  double t83;
  double t82;
  double t79;
  double t78;
  double t77;
  double t75;
  double t74;
  double t70;
  double t68;
  double t67;
  double t66;
  double t65;
  double t64;
  double t63;
  double t61;
  double t59;
  double t58;
  double t57;
  double t55;
  double t54;
  double t53;
  double t52;
  double t51;
  double t50;
  double t49;
  double t48;
  double t47;
  double t46;
  double t45;
  double t44;
  double t43;
  double t42;
  double t41;
  double t40;
  double t39;
  double t37;
  double t36;
  double t35;
  double t34;
  double t33;
  double t32;
  double t31;
  double t29;
  double t28;
  double t27;
  double t26;
  double t25;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t18;
  double t16;
  double t14;
  double t13;
  double t12;
  double t11;
  double t9;
  double t8;
  double t7;
  double t5;
  double t4;
  double t3;
  double local_2c00;
  double local_2bf8;
  double local_2bf0;
  double local_2be8;
  double local_2be0;
  double local_2bd8;
  double local_2bd0;
  double local_2bc8;
  double local_2bc0;
  double local_2bb8;
  double local_2bb0;
  double local_2ba8;
  double local_2ba0;
  double local_2b98;
  double local_2b90;
  double local_2b88;
  double local_2b80;
  double local_2b78;
  double local_2b70;
  double local_2b68;
  double local_2b60;
  double local_2b58;
  double local_2b50;
  double local_2b48;
  double local_2b40;
  double local_2b38;
  double local_2b30;
  double local_2b28;
  double local_2b20;
  double local_2b18;
  double local_2b10;
  double local_2b08;
  double local_2b00;
  double local_2af8;
  double local_2af0;
  double local_2ae8;
  double local_2ae0;
  double local_2ad8;
  double local_2ad0;
  double local_2ac8;
  double local_2ac0;
  double local_2ab8;
  double local_2ab0;
  double local_2aa8;
  double local_2aa0;
  double local_2a98;
  double local_2a90;
  double local_2a88;
  double local_2a80;
  double local_2a78;
  double local_2a70;
  double local_2a68;
  double local_2a60;
  double local_2a58;
  double local_2a50;
  double local_2a48;
  double local_2a40;
  double local_2a38;
  double local_2a30;
  double local_2a28;
  double local_2a20;
  double local_2a18;
  double local_2a10;
  double local_2a08;
  double local_2a00;
  double local_29f8;
  double local_29f0;
  double local_29e8;
  double local_29e0;
  double local_29d8;
  double local_29d0;
  double local_29c8;
  double local_29c0;
  double local_29b8;
  double local_29b0;
  double local_29a8;
  double local_29a0;
  double local_2998;
  double local_2990;
  double local_2988;
  double local_2980;
  double local_2978;
  double local_2970;
  double local_2968;
  double local_2960;
  double local_2958;
  double local_2950;
  double local_2948;
  double local_2940;
  double local_2938;
  double local_2930;
  double local_2928;
  
  dVar6 = (double)(*in_RDX / 2.0 <= (double)in_RDI[0x30]);
  dVar7 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_2928 = (double)in_RDI[0x31] - 1.0;
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      local_2930 = -local_2928;
    }
    else {
      local_2930 = 0.0;
    }
    local_2928 = local_2930;
  }
  local_2928 = local_2928 + 1.0;
  dVar7 = (double)(local_2928 <= (double)in_RDI[0x31]);
  local_2948 = cbrt((double)in_RDI[0x31]);
  dVar8 = cbrt(local_2928);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    local_2938 = local_2948 * (double)in_RDI[0x31];
  }
  else {
    local_2938 = dVar8 * local_2928;
  }
  dVar9 = cbrt(*in_RDX);
  dVar10 = local_2938 * dVar9;
  dVar11 = 1.0 / *in_RDX;
  dVar12 = *in_RCX * dVar11;
  dVar13 = 1.0 / *in_R9;
  local_2940 = (dVar12 * dVar13) / 8.0;
  dVar14 = (double)(local_2940 < 1.0);
  if ((dVar14 == 0.0) && (!NAN(dVar14))) {
    local_2940 = 1.0;
  }
  dVar15 = local_2940 * local_2940;
  dVar16 = dVar15 * local_2940 * 3.0 + dVar15;
  dVar17 = dVar15 * local_2940 + 1.0;
  dVar18 = dVar17 * dVar17;
  dVar19 = 1.0 / dVar18;
  dVar20 = dVar16 * dVar19;
  dVar21 = cbrt(9.0);
  dVar22 = cbrt(0.3183098861837907);
  dVar22 = dVar21 * dVar21 * dVar22 * dVar22;
  dVar23 = dVar22 * (double)in_RDI[4];
  dVar24 = 1.0 / dVar9;
  dVar25 = cbrt(9.869604401089358);
  dVar26 = 1.0 / (dVar25 * dVar25);
  dVar27 = dVar26 * 1.8171205928321397;
  dVar28 = *in_RCX * 1.5874010519681996;
  dVar29 = *in_RDX * *in_RDX;
  dVar30 = dVar9 * dVar9;
  dVar31 = (1.0 / dVar30) / dVar29;
  dVar32 = dVar28 * dVar31;
  dVar33 = dVar27 * dVar32;
  dVar34 = (1.0 / dVar25) / 9.869604401089358;
  dVar35 = dVar34 * 3.3019272488946267;
  dVar36 = *in_RCX * *in_RCX * 1.2599210498948732;
  dVar37 = dVar29 * dVar29;
  dVar21 = *in_RDX;
  dVar38 = (1.0 / dVar9) / (dVar37 * dVar21);
  dVar39 = dVar35 * 0.00537989809245259 * dVar36 * dVar38 + dVar33 * 0.1504548888888889 + 1.0;
  dVar40 = pow(dVar39,0.1);
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_2948 = dVar8;
  }
  local_2948 = 1.0 / local_2948;
  dVar7 = (1.0 / dVar40) * local_2948;
  local_2950 = (dVar23 * dVar24 * 1.4422495703074083 * dVar7) / 18.0;
  dVar8 = (double)(local_2950 < 1e-10);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2950 = 1e-10;
  }
  dVar41 = (double)(1.35 <= local_2950);
  dVar42 = (double)(1.35 < local_2950);
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2958 = local_2950;
  }
  else {
    local_2958 = 1.35;
  }
  dVar43 = local_2958 * local_2958;
  dVar44 = dVar43 * dVar43;
  dVar45 = 1.0 / dVar44;
  dVar46 = 1.0 / (dVar44 * dVar43);
  dVar47 = dVar44 * dVar44;
  dVar48 = 1.0 / dVar47;
  dVar49 = (1.0 / dVar47) / dVar43;
  dVar50 = (1.0 / dVar47) / dVar44;
  dVar51 = (1.0 / dVar47) / (dVar44 * dVar43);
  dVar52 = dVar47 * dVar47;
  dVar53 = 1.0 / dVar52;
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2960 = 1.35;
  }
  else {
    local_2960 = local_2950;
  }
  dVar54 = sqrt(3.141592653589793);
  dVar55 = 1.0 / local_2960;
  dVar56 = erf(dVar55 / 2.0);
  dVar57 = local_2960 * local_2960;
  dVar58 = 1.0 / dVar57;
  dVar59 = exp(-dVar58 / 4.0);
  dVar60 = dVar59 - 1.0;
  dVar61 = -(dVar57 * 2.0) * dVar60 + (dVar59 - 1.5);
  dVar56 = local_2960 * 2.0 * dVar61 + dVar54 * dVar56;
  if ((dVar41 != 0.0) || (NAN(dVar41))) {
    local_2968 = (((((((1.0 / dVar43) / 36.0 - dVar45 / 960.0) + dVar46 / 26880.0) -
                    dVar48 / 829440.0) + dVar49 / 28385280.0) - dVar50 / 1073479680.0) +
                 dVar51 / 44590694400.0) - dVar53 / 2021444812800.0;
  }
  else {
    local_2968 = -(local_2960 * 2.6666666666666665) * dVar56 + 1.0;
  }
  dVar62 = pow(dVar39,0.2);
  dVar63 = 1.0 / dVar62;
  dVar64 = (double)(0.27 <= local_2950);
  dVar65 = (double)(0.27 < local_2950);
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2970 = local_2950;
  }
  else {
    local_2970 = 0.27;
  }
  dVar66 = local_2970 * local_2970;
  dVar67 = dVar66 * dVar66;
  dVar68 = dVar67 * dVar67;
  dVar69 = dVar68 * dVar67;
  dVar70 = dVar68 * dVar68;
  dVar71 = dVar70 * dVar70;
  dVar72 = (1.0 / dVar71) / dVar69;
  dVar73 = dVar67 * dVar66;
  dVar74 = dVar68 * dVar73;
  dVar75 = (1.0 / dVar71) / dVar74;
  dVar76 = 1.0 / dVar73;
  dVar77 = 1.0 / dVar68;
  dVar78 = dVar68 * dVar66;
  dVar79 = 1.0 / dVar78;
  dVar80 = 1.0 / dVar69;
  dVar81 = 1.0 / dVar74;
  dVar82 = 1.0 / dVar70;
  dVar83 = 1.0 / (dVar70 * dVar66);
  dVar84 = (1.0 / dVar70) / dVar67;
  dVar85 = (1.0 / dVar70) / dVar73;
  dVar86 = (1.0 / dVar70) / dVar68;
  dVar87 = (1.0 / dVar70) / dVar78;
  dVar69 = (1.0 / dVar70) / dVar69;
  dVar74 = (1.0 / dVar70) / dVar74;
  dVar88 = 1.0 / dVar71;
  dVar89 = (1.0 / dVar71) / dVar66;
  dVar90 = (1.0 / dVar71) / dVar67;
  dVar73 = (1.0 / dVar71) / dVar73;
  dVar91 = (1.0 / dVar71) / dVar68;
  dVar78 = (1.0 / dVar71) / dVar78;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2978 = 0.27;
  }
  else {
    local_2978 = local_2950;
  }
  dVar92 = local_2978 * local_2978;
  dVar93 = dVar92 * dVar92;
  dVar94 = dVar92 * 20.0 + -(dVar93 * 64.0);
  dVar95 = exp((-1.0 / dVar92) / 4.0);
  dVar96 = erf((1.0 / local_2978) / 2.0);
  dVar97 = (dVar92 * -36.0 + dVar54 * 10.0 * local_2978 * dVar96 + dVar94 * dVar95 + dVar93 * 64.0)
           - 3.0;
  if ((dVar64 != 0.0) || (NAN(dVar64))) {
    local_2980 = ((((((dVar77 * 3.804788961038961e-06 +
                      (((dVar72 / 3.3929038000650147e+37 - dVar75 / 3.511556992918352e+39) +
                       0.0013392857142857143 / dVar67) - dVar76 / 11520.0)) - dVar79 / 7454720.0) +
                    dVar80 / 247726080.0) - dVar81 / 9358540800.0) + dVar82 / 394474291200.0) -
                 dVar83 / 18311911833600.0) + dVar84 / 927028425523200.0 +
                 ((((((((((-dVar85 / 5.0785035485184e+16 + dVar86 / 2.991700272218112e+18) -
                         dVar87 / 1.88514051721003e+20) + dVar69 / 1.2648942844388573e+22) -
                       dVar74 / 9.002316741416457e+23) + dVar88 / 6.772652029299977e+25) -
                     dVar89 / 5.36974553751641e+27) + dVar90 / 4.474731034888079e+29) -
                   dVar73 / 3.909716563474291e+31) + dVar91 / 3.5738523369945735e+33) -
                 dVar78 / 3.410951160703658e+35);
  }
  else {
    local_2980 = dVar92 * 24.0 * dVar97 + 1.0;
  }
  dVar98 = *in_R9 * 1.5874010519681996;
  dVar99 = (1.0 / dVar30) / *in_RDX;
  dVar100 = dVar98 * dVar99 * 0.14554132;
  dVar25 = dVar25 * dVar25 * 3.3019272488946267;
  dVar101 = dVar32 * 0.04229627833333333 + dVar25 * 0.043662396 + -dVar100;
  dVar102 = local_2980 * dVar101;
  dVar103 = dVar62 * dVar62;
  dVar104 = 1.0 / dVar103;
  dVar105 = dVar27 * dVar104;
  dVar106 = (double)(0.32 <= local_2950);
  dVar107 = (double)(0.32 < local_2950);
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2988 = local_2950;
  }
  else {
    local_2988 = 0.32;
  }
  dVar108 = local_2988 * local_2988;
  dVar109 = dVar108 * dVar108;
  dVar110 = dVar109 * dVar108;
  dVar111 = 1.0 / dVar110;
  dVar112 = dVar109 * dVar109;
  dVar113 = 1.0 / dVar112;
  dVar114 = 1.0 / (dVar112 * dVar108);
  dVar115 = 1.0 / (dVar112 * dVar109);
  dVar116 = 1.0 / (dVar112 * dVar110);
  dVar117 = dVar112 * dVar112;
  dVar118 = 1.0 / dVar117;
  dVar119 = (1.0 / dVar117) / dVar108;
  dVar120 = (1.0 / dVar117) / dVar109;
  dVar121 = (1.0 / dVar117) / dVar110;
  dVar122 = (1.0 / dVar117) / dVar112;
  dVar123 = (1.0 / dVar117) / (dVar112 * dVar108);
  dVar124 = (1.0 / dVar117) / (dVar112 * dVar109);
  dVar125 = (1.0 / dVar117) / (dVar112 * dVar110);
  dVar126 = dVar117 * dVar117;
  dVar127 = 1.0 / dVar126;
  dVar128 = (1.0 / dVar126) / dVar108;
  dVar129 = (1.0 / dVar126) / dVar109;
  dVar110 = (1.0 / dVar126) / dVar110;
  local_2998 = (((((((((((((((dVar113 * 5.871587902837903e-07 +
                             (0.0003826530612244898 / dVar109 - dVar111 / 56448.0)) -
                            dVar114 / 61501440.0) + dVar115 / 2530344960.0) -
                          dVar116 / 115811942400.0) + dVar118 / 5811921223680.0) -
                        dVar119 / 316612955602944.0) + dVar120 / 1.85827061661696e+16) -
                      dVar121 / 1.168055816159232e+18) + dVar122 / 7.824446865801216e+19) -
                    dVar123 / 5.562511054710453e+21) + dVar124 / 4.181740504354862e+23) -
                  dVar125 / 3.3139778504339334e+25) + dVar127 / 2.7608516801793436e+27) -
                dVar128 / 2.4119107039344544e+29) + dVar129 / 2.2046293272414373e+31) -
               dVar110 / 2.1042094544618633e+33;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2990 = 0.32;
  }
  else {
    local_2990 = local_2950;
  }
  dVar130 = local_2990 * local_2990;
  dVar131 = dVar130 * local_2990;
  dVar132 = dVar130 * dVar130;
  dVar133 = dVar132 * local_2990;
  dVar134 = dVar132 * dVar131;
  dVar135 = dVar132 * dVar132;
  dVar136 = dVar135 * local_2990 * -122880.0 +
            dVar134 * 3840.0 + dVar133 * -576.0 + local_2990 * -8.0 + dVar131 * 256.0;
  dVar137 = 1.0 / dVar130;
  dVar138 = exp(-dVar137 / 4.0);
  dVar139 = dVar132 * dVar130;
  dVar140 = dVar139 * 5120.0 + dVar132 * -1440.0 + dVar130 * 224.0 + -35.0;
  dVar141 = dVar130 * 60.0 + -2.0;
  dVar142 = 1.0 / local_2990;
  dVar143 = erf(dVar142 / 2.0);
  dVar144 = dVar136 * dVar138 + dVar54 * 2.0 * dVar141 * dVar143 + dVar131 * 24.0 * dVar140;
  if ((dVar106 == 0.0) && (!NAN(dVar106))) {
    local_2998 = local_2990 * 1.1428571428571428 * dVar144 + 1.0;
  }
  dVar145 = local_2998 * 1.8171205928321397 * dVar26;
  dVar146 = dVar28 * dVar31 * dVar104;
  dVar147 = dVar145 * 0.026329605555555555 * dVar146 +
            local_2968 * dVar63 + dVar102 * 0.43209876543209874 * dVar105;
  dVar148 = 1.0 - dVar20;
  local_29a8 = (dVar23 * dVar24 * 1.4422495703074083 * local_2948) / 18.0;
  dVar149 = (double)(1.35 <= local_29a8);
  dVar150 = (double)(1.35 < local_29a8);
  local_29a0 = local_29a8;
  if ((dVar150 == 0.0) && (!NAN(dVar150))) {
    local_29a0 = 1.35;
  }
  dVar151 = local_29a0 * local_29a0;
  dVar152 = dVar151 * dVar151;
  dVar153 = 1.0 / (dVar152 * dVar151);
  dVar154 = dVar152 * dVar152;
  dVar155 = (1.0 / dVar154) / dVar151;
  dVar156 = (1.0 / dVar154) / dVar152;
  dVar157 = (1.0 / dVar154) / (dVar152 * dVar151);
  dVar158 = dVar154 * dVar154;
  if ((dVar150 != 0.0) || (NAN(dVar150))) {
    local_29a8 = 1.35;
  }
  dVar159 = 1.0 / local_29a8;
  dVar160 = erf(dVar159 / 2.0);
  dVar161 = local_29a8 * local_29a8;
  dVar162 = 1.0 / dVar161;
  dVar163 = exp(-dVar162 / 4.0);
  dVar164 = dVar163 - 1.0;
  dVar165 = -(dVar161 * 2.0) * dVar164 + (dVar163 - 1.5);
  dVar160 = dVar54 * dVar160 + local_29a8 * 2.0 * dVar165;
  if ((dVar149 != 0.0) || (NAN(dVar149))) {
    local_29b0 = (((((((1.0 / dVar151) / 36.0 - (1.0 / dVar152) / 960.0) + dVar153 / 26880.0) -
                    (1.0 / dVar154) / 829440.0) + dVar155 / 28385280.0) - dVar156 / 1073479680.0) +
                 dVar157 / 44590694400.0) - (1.0 / dVar158) / 2021444812800.0;
  }
  else {
    local_29b0 = -(local_29a8 * 2.6666666666666665) * dVar160 + 1.0;
  }
  dVar166 = dVar148 * local_29b0;
  dVar167 = (dVar33 * 0.0028577960676726107 + 0.12345679012345678) * 1.8171205928321397;
  dVar168 = dVar167 * dVar26;
  dVar169 = (((dVar98 * dVar99 - dVar32 / 8.0) * 1.8171205928321397 * dVar26) / 4.0 - 0.45) +
            dVar33 / 36.0;
  dVar170 = dVar169 * local_2940;
  dVar171 = 1.0 - local_2940;
  dVar172 = -(dVar170 * 1.0814814814814815) * dVar171 +
            dVar169 * dVar169 * 0.7209876543209877 + dVar168 * 0.4166666666666667 * dVar32 + 1.0;
  dVar173 = pow(dVar172,0.1);
  dVar33 = -((dVar32 * 0.011867481666666667 + dVar25 * 0.256337604 + dVar100) * 0.5555555555555556 *
            1.8171205928321397) * dVar26 + dVar33 * 0.06394332777777778 + 1.0;
  dVar25 = dVar33 * 0.7777777777777778 * dVar104 + dVar63;
  dVar32 = dVar148 * dVar173 +
           -(double)in_RDI[6] * (dVar20 * dVar147 + dVar166 * dVar173) + dVar20 * dVar25;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_29b8 = 0.0;
  }
  else {
    local_29b8 = dVar10 * -0.36927938319101117 * dVar32;
  }
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar5 * 8) =
         local_29b8 * 2.0 + *(double *)(*in_stack_00000008 + lVar5 * 8);
  }
  dVar100 = local_2938 / dVar30;
  dVar174 = *in_RCX * (1.0 / dVar29);
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_29c0 = (-dVar174 * dVar13) / 8.0;
  }
  else {
    local_29c0 = 0.0;
  }
  dVar175 = dVar15 * local_29c0;
  dVar176 = local_2940 * local_29c0 + local_2940 * local_29c0 + dVar175 * 9.0;
  dVar177 = dVar176 * dVar19;
  dVar17 = (1.0 / dVar18) / dVar17;
  dVar178 = dVar16 * dVar17;
  dVar179 = dVar147 * dVar15;
  dVar180 = dVar179 * local_29c0;
  dVar181 = dVar43 * local_2958;
  dVar182 = 1.0 / dVar181;
  dVar183 = (1.0 / dVar9) / *in_RDX;
  dVar184 = dVar183 * 1.4422495703074083;
  dVar1 = (double)in_RDI[4];
  dVar185 = dVar22 * dVar1 * 1.4422495703074083;
  dVar186 = (1.0 / dVar40) / dVar39;
  dVar187 = dVar24 * dVar186;
  dVar188 = dVar29 * *in_RDX;
  dVar189 = (1.0 / dVar30) / dVar188;
  dVar190 = dVar28 * dVar189;
  dVar191 = dVar27 * dVar190;
  dVar192 = (1.0 / dVar9) / (dVar37 * dVar29);
  dVar193 = dVar35 * dVar36 * dVar192;
  dVar194 = dVar191 * -0.40121303703703703 + -(dVar193 * 0.028692789826413812);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_29c8 = 0.0;
  }
  else {
    local_29c8 = (-dVar23 * dVar184 * dVar7) / 54.0 -
                 (dVar185 * dVar187 * local_2948 * dVar194) / 180.0;
  }
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_29d0 = local_29c8;
  }
  else {
    local_29d0 = 0.0;
  }
  dVar195 = 1.0 / (dVar44 * local_2958);
  dVar196 = 1.0 / (dVar44 * dVar181);
  dVar197 = (1.0 / dVar47) / local_2958;
  dVar198 = (1.0 / dVar47) / dVar181;
  dVar199 = (1.0 / dVar47) / (dVar44 * local_2958);
  dVar44 = (1.0 / dVar47) / (dVar44 * dVar181);
  local_2958 = (1.0 / dVar52) / local_2958;
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_29d8 = 0.0;
  }
  else {
    local_29d8 = local_29c8;
  }
  dVar47 = dVar59 * dVar58;
  dVar181 = 1.0 / (dVar57 * local_2960);
  dVar200 = local_2960 * dVar60;
  dVar201 = -(dVar55 * local_29d8) * dVar59 +
            -(dVar200 * 4.0) * local_29d8 + (dVar181 * local_29d8 * dVar59) / 2.0;
  dVar202 = -local_29d8 * dVar47 + local_2960 * 2.0 * dVar201 + dVar61 * 2.0 * local_29d8;
  if ((dVar41 != 0.0) || (NAN(dVar41))) {
    local_29e0 = (((((((-dVar182 * local_29d0) / 18.0 + (dVar195 * local_29d0) / 240.0) -
                     (dVar196 * local_29d0) / 4480.0) + (dVar197 * local_29d0) / 103680.0) -
                   (dVar198 * local_29d0) / 2838528.0) + (dVar199 * local_29d0) / 89456640.0) -
                 (dVar44 * local_29d0) / 3185049600.0) + (local_2958 * local_29d0) / 126340300800.0;
  }
  else {
    local_29e0 = local_2960 * -2.6666666666666665 * dVar202 +
                 -(local_29d8 * 2.6666666666666665 * dVar56);
  }
  dVar203 = (1.0 / dVar62) / dVar39;
  dVar204 = local_2968 * dVar203;
  dVar205 = dVar67 * local_2970;
  dVar206 = dVar68 * dVar205;
  dVar207 = (1.0 / dVar71) / dVar206;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_29e8 = local_29c8;
  }
  else {
    local_29e8 = 0.0;
  }
  dVar66 = dVar66 * local_2970;
  dVar67 = dVar67 * dVar66;
  dVar208 = dVar68 * dVar67;
  dVar209 = (1.0 / dVar71) / dVar208;
  dVar210 = 1.0 / dVar205;
  dVar211 = 1.0 / dVar67;
  dVar212 = dVar68 * local_2970;
  dVar213 = 1.0 / dVar212;
  dVar68 = dVar68 * dVar66;
  dVar214 = 1.0 / dVar68;
  dVar215 = 1.0 / dVar206;
  dVar216 = 1.0 / dVar208;
  dVar217 = 1.0 / (dVar70 * local_2970);
  dVar218 = (1.0 / dVar70) / dVar66;
  dVar219 = (1.0 / dVar70) / dVar205;
  dVar220 = (1.0 / dVar70) / dVar67;
  dVar221 = (1.0 / dVar70) / dVar212;
  dVar222 = (1.0 / dVar70) / dVar68;
  dVar206 = (1.0 / dVar70) / dVar206;
  dVar208 = (1.0 / dVar70) / dVar208;
  local_2970 = (1.0 / dVar71) / local_2970;
  dVar66 = (1.0 / dVar71) / dVar66;
  dVar205 = (1.0 / dVar71) / dVar205;
  dVar67 = (1.0 / dVar71) / dVar67;
  dVar212 = (1.0 / dVar71) / dVar212;
  dVar68 = (1.0 / dVar71) / dVar68;
  dVar223 = local_2978 * dVar97;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_29f0 = 0.0;
  }
  else {
    local_29f0 = local_29c8;
  }
  dVar224 = dVar92 * local_2978;
  dVar225 = dVar224 * 256.0 * local_29f0;
  dVar226 = local_2978 * local_29f0 * 40.0 + -dVar225;
  dVar227 = 1.0 / dVar224;
  dVar228 = dVar94 * dVar227;
  dVar229 = local_29f0 * dVar95;
  dVar230 = (1.0 / local_2978) * dVar95;
  dVar225 = -(dVar230 * 10.0) * local_29f0 +
            local_29f0 * 10.0 * dVar54 * dVar96 +
            local_2978 * local_29f0 * -72.0 + dVar226 * dVar95 + (dVar228 * dVar229) / 2.0 + dVar225
  ;
  if ((dVar64 != 0.0) || (NAN(dVar64))) {
    local_29f8 = ((((((-(dVar213 * 3.0438311688311688e-05) * local_29e8 +
                       -(dVar210 * 0.005357142857142857) * local_29e8 +
                       (-dVar207 * local_29e8) / 7.71114500014776e+35 +
                       (dVar209 * local_29e8) / 7.633819549822504e+37 +
                       (dVar211 * local_29e8) / 1920.0 + (dVar214 * local_29e8) / 745472.0) -
                     (dVar215 * local_29e8) / 20643840.0) + (dVar216 * local_29e8) / 668467200.0) -
                   (dVar217 * local_29e8) / 24654643200.0) +
                  (dVar218 * local_29e8) / 1017328435200.0) -
                 (dVar219 * local_29e8) / 46351421276160.0) +
                 ((((((((((dVar220 * local_29e8) / 2.308410703872e+15 -
                         (dVar221 * local_29e8) / 1.24654178009088e+17) +
                        (dVar222 * local_29e8) / 7.250540450807808e+18) -
                       (dVar206 * local_29e8) / 4.517479587281633e+20) +
                      (dVar208 * local_29e8) / 3.000772247138819e+22) -
                     (local_2970 * local_29e8) / 2.116453759156243e+24) +
                    (dVar66 * local_29e8) / 1.5793369227989443e+26) -
                   (dVar205 * local_29e8) / 1.2429808430244664e+28) +
                  (dVar67 * local_29e8) / 1.0288727798616555e+30) -
                 (dVar212 * local_29e8) / 8.934630842486435e+31) +
                 (dVar68 * local_29e8) / 8.121312287389663e+33;
  }
  else {
    local_29f8 = dVar92 * 24.0 * dVar225 + dVar223 * 48.0 * local_29f0;
  }
  dVar231 = dVar98 * dVar31 * 0.24256886666666666;
  dVar232 = dVar190 * -0.11279007555555555 + dVar231;
  dVar233 = dVar102 * 1.8171205928321397;
  dVar234 = (1.0 / dVar103) / dVar39;
  dVar235 = dVar26 * dVar234;
  dVar236 = dVar235 * dVar194;
  dVar237 = dVar109 * local_2988;
  dVar238 = 1.0 / dVar237;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2a00 = local_29c8;
  }
  else {
    local_2a00 = 0.0;
  }
  dVar108 = dVar108 * local_2988;
  dVar109 = dVar109 * dVar108;
  dVar239 = 1.0 / dVar109;
  dVar240 = 1.0 / (dVar112 * local_2988);
  dVar241 = 1.0 / (dVar112 * dVar108);
  dVar242 = 1.0 / (dVar112 * dVar237);
  dVar243 = 1.0 / (dVar112 * dVar109);
  dVar244 = (1.0 / dVar117) / local_2988;
  dVar245 = (1.0 / dVar117) / dVar108;
  dVar246 = (1.0 / dVar117) / dVar237;
  dVar247 = (1.0 / dVar117) / dVar109;
  dVar248 = (1.0 / dVar117) / (dVar112 * local_2988);
  dVar249 = (1.0 / dVar117) / (dVar112 * dVar108);
  dVar250 = (1.0 / dVar117) / (dVar112 * dVar237);
  dVar117 = (1.0 / dVar117) / (dVar112 * dVar109);
  local_2988 = (1.0 / dVar126) / local_2988;
  dVar108 = (1.0 / dVar126) / dVar108;
  dVar237 = (1.0 / dVar126) / dVar237;
  dVar109 = (1.0 / dVar126) / dVar109;
  local_2a10 = ((((((((((((((-(dVar240 * 4.6972703222703225e-06) * local_2a00 +
                             dVar238 * -0.001530612244897959 * local_2a00 +
                             (dVar239 * local_2a00) / 9408.0 + (dVar241 * local_2a00) / 6150144.0) -
                           (dVar242 * local_2a00) / 210862080.0) +
                          (dVar243 * local_2a00) / 8272281600.0) -
                         (dVar244 * local_2a00) / 363245076480.0) +
                        (dVar245 * local_2a00) / 17589608644608.0) -
                       (dVar246 * local_2a00) / 929135308308480.0) +
                      (dVar247 * local_2a00) / 5.3093446189056e+16) -
                     (dVar248 * local_2a00) / 3.26018619408384e+18) +
                    (dVar249 * local_2a00) / 2.1394273287347896e+20) -
                   (dVar250 * local_2a00) / 1.493478751555308e+22) +
                  (dVar117 * local_2a00) / 1.1046592834779778e+24) -
                 (local_2988 * local_2a00) / 8.627661500560449e+25) +
                (dVar108 * local_2a00) / 7.093855011571925e+27) -
               (dVar237 * local_2a00) / 6.123970353448437e+29) +
               (dVar109 * local_2a00) / 5.53739330121543e+31;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2a08 = 0.0;
  }
  else {
    local_2a08 = local_29c8;
  }
  dVar251 = dVar132 * local_2a08 * -2880.0 +
            dVar130 * local_2a08 * 768.0 +
            local_2a08 * -8.0 + dVar135 * -1105920.0 * local_2a08 + dVar139 * 26880.0 * local_2a08;
  dVar252 = 1.0 / dVar131;
  dVar253 = dVar136 * dVar252;
  dVar254 = local_2a08 * dVar138;
  dVar255 = dVar130 * dVar140;
  dVar256 = dVar133 * local_2a08 * 30720.0 +
            local_2990 * local_2a08 * 448.0 + -(dVar131 * local_2a08 * 5760.0);
  dVar257 = dVar54 * local_2990;
  dVar258 = dVar141 * dVar138;
  dVar259 = -(dVar258 * 2.0) * dVar137 * local_2a08 +
            dVar257 * 240.0 * local_2a08 * dVar143 +
            dVar131 * 24.0 * dVar256 +
            dVar255 * 72.0 * local_2a08 + dVar251 * dVar138 + (dVar253 * dVar254) / 2.0;
  if ((dVar106 == 0.0) && (!NAN(dVar106))) {
    local_2a10 = local_2990 * 1.1428571428571428 * dVar259 +
                 local_2a08 * 1.1428571428571428 * dVar144;
  }
  dVar260 = local_2a10 * 1.8171205928321397 * dVar26;
  dVar261 = dVar28 * dVar189 * dVar104;
  dVar262 = dVar26 * *in_RCX;
  dVar263 = local_2998 * 1.8171205928321397 * dVar262;
  dVar264 = dVar31 * 1.5874010519681996;
  dVar265 = dVar234 * dVar194;
  dVar266 = dVar264 * dVar265;
  dVar267 = -(dVar263 * 0.010531842222222223) * dVar266 +
            -(dVar145 * 0.07021228148148148) * dVar261 +
            dVar260 * 0.026329605555555555 * dVar146 +
            -(dVar233 * 0.1728395061728395) * dVar236 +
            local_2980 * dVar232 * 0.43209876543209874 * dVar105 +
            local_29f8 * dVar101 * 0.43209876543209874 * dVar105 +
            local_29e0 * dVar63 + -((dVar204 * dVar194) / 5.0);
  dVar268 = dVar175 * 6.0 * dVar178 + -dVar177;
  dVar269 = dVar268 * local_29b0;
  dVar270 = dVar151 * local_29a0;
  local_2a20 = (dVar23 * dVar184 * local_2948) / 54.0;
  if ((dVar150 != 0.0) || (NAN(dVar150))) {
    local_2a18 = -local_2a20;
  }
  else {
    local_2a18 = 0.0;
  }
  dVar184 = 1.0 / (dVar152 * local_29a0);
  dVar271 = 1.0 / (dVar152 * dVar270);
  dVar272 = (1.0 / dVar154) / local_29a0;
  dVar273 = (1.0 / dVar154) / dVar270;
  dVar274 = (1.0 / dVar154) / (dVar152 * local_29a0);
  dVar275 = (1.0 / dVar154) / (dVar152 * dVar270);
  local_29a0 = (1.0 / dVar158) / local_29a0;
  if ((dVar150 != 0.0) || (NAN(dVar150))) {
    local_2a20 = 0.0;
  }
  else {
    local_2a20 = -local_2a20;
  }
  dVar276 = 1.0 / (dVar161 * local_29a8);
  dVar277 = -(dVar159 * local_2a20) * dVar163 +
            -(local_29a8 * dVar164 * 4.0) * local_2a20 + (dVar276 * local_2a20 * dVar163) / 2.0;
  dVar278 = -local_2a20 * dVar163 * dVar162 +
            local_29a8 * 2.0 * dVar277 + dVar165 * 2.0 * local_2a20;
  if ((dVar149 != 0.0) || (NAN(dVar149))) {
    local_2a28 = (((((((-(1.0 / dVar270) * local_2a18) / 18.0 + (dVar184 * local_2a18) / 240.0) -
                     (dVar271 * local_2a18) / 4480.0) + (dVar272 * local_2a18) / 103680.0) -
                   (dVar273 * local_2a18) / 2838528.0) + (dVar274 * local_2a18) / 89456640.0) -
                 (dVar275 * local_2a18) / 3185049600.0) + (local_29a0 * local_2a18) / 126340300800.0
    ;
  }
  else {
    local_2a28 = local_29a8 * -2.6666666666666665 * dVar278 +
                 -(local_2a20 * 2.6666666666666665 * dVar160);
  }
  dVar279 = dVar148 * local_2a28;
  dVar280 = dVar173 * dVar173 * dVar173 * dVar173;
  dVar280 = dVar280 * dVar280 * dVar173;
  dVar281 = 1.0 / dVar280;
  dVar282 = dVar191 * -0.07407407407407407 +
            ((dVar98 * dVar31 * -1.6666666666666667 + dVar190 / 3.0) * 1.8171205928321397 * dVar26)
            / 4.0;
  dVar283 = dVar282 * local_2940;
  dVar193 = dVar170 * 1.0814814814814815 * local_29c0 +
            -(dVar169 * 1.0814814814814815 * local_29c0) * dVar171 +
            -(dVar283 * 1.0814814814814815) * dVar171 +
            dVar169 * 1.4419753086419753 * dVar282 +
            dVar193 * -0.006350657928161358 + -(dVar168 * 1.1111111111111112 * dVar190);
  dVar284 = dVar281 * dVar193;
  dVar285 = dVar25 * dVar15;
  dVar286 = dVar285 * local_29c0;
  dVar287 = dVar191 * -0.17051554074074074 +
            -((dVar190 * -0.031646617777777775 + -dVar231) * 0.5555555555555556 * 1.8171205928321397
             * dVar26);
  dVar190 = dVar33 * dVar234;
  dVar191 = -(dVar190 * 0.3111111111111111) * dVar194 +
            dVar287 * 0.7777777777777778 * dVar104 + (-dVar203 * dVar194) / 5.0;
  dVar231 = dVar148 * dVar281;
  dVar288 = dVar268 * dVar173 +
            dVar20 * dVar191 +
            -(dVar178 * 6.0) * dVar286 +
            -(double)in_RDI[6] *
            (dVar279 * dVar173 +
             dVar269 * dVar173 + dVar20 * dVar267 + dVar177 * dVar147 + -(dVar178 * 6.0 * dVar180) +
            (dVar166 * dVar284) / 10.0) + dVar177 * dVar25 + (dVar231 * dVar193) / 10.0;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2a30 = 0.0;
  }
  else {
    local_2a30 = -(dVar10 * 0.36927938319101117) * dVar288 +
                 (dVar100 * -0.9847450218426964 * dVar32) / 8.0;
  }
  if ((in_stack_00000008[1] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x5c);
    *(double *)(in_stack_00000008[1] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2a30 + local_29b8 * 2.0 +
         *(double *)(in_stack_00000008[1] + lVar5 * 8);
  }
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2a38 = (dVar11 * dVar13) / 8.0;
  }
  else {
    local_2a38 = 0.0;
  }
  dVar289 = local_2940 * local_2a38;
  dVar290 = dVar15 * local_2a38;
  dVar291 = dVar289 + dVar289 + dVar290 * 9.0;
  dVar292 = dVar291 * dVar19;
  dVar293 = dVar179 * local_2a38;
  dVar2 = *in_RCX;
  dVar294 = dVar35 * dVar2 * 1.2599210498948732 * dVar38;
  dVar295 = dVar27 * 0.1504548888888889 * dVar264 + dVar294 * 0.01075979618490518;
  dVar296 = local_2948 * dVar295;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2a40 = 0.0;
  }
  else {
    local_2a40 = (-dVar185 * dVar187 * dVar296) / 180.0;
  }
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2a48 = local_2a40;
  }
  else {
    local_2a48 = 0.0;
  }
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2a50 = 0.0;
  }
  else {
    local_2a50 = local_2a40;
  }
  dVar297 = -(dVar55 * local_2a50) * dVar59 +
            -(dVar200 * 4.0) * local_2a50 + (dVar181 * local_2a50 * dVar59) / 2.0;
  dVar298 = dVar297 * 2.0 * local_2960 + local_2a50 * 2.0 * dVar61 + -(local_2a50 * dVar47);
  if ((dVar41 != 0.0) || (NAN(dVar41))) {
    local_2a58 = (((((((-dVar182 * local_2a48) / 18.0 + (dVar195 * local_2a48) / 240.0) -
                     (dVar196 * local_2a48) / 4480.0) + (dVar197 * local_2a48) / 103680.0) -
                   (dVar198 * local_2a48) / 2838528.0) + (dVar199 * local_2a48) / 89456640.0) -
                 (dVar44 * local_2a48) / 3185049600.0) + (local_2958 * local_2a48) / 126340300800.0;
  }
  else {
    local_2a58 = local_2a50 * -2.6666666666666665 * dVar56 +
                 -(local_2960 * 2.6666666666666665 * dVar298);
  }
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2a60 = local_2a40;
  }
  else {
    local_2a60 = 0.0;
  }
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2a68 = 0.0;
  }
  else {
    local_2a68 = local_2a40;
  }
  dVar299 = dVar224 * 256.0 * local_2a68;
  dVar300 = local_2978 * local_2a68 * 40.0 + -dVar299;
  dVar301 = local_2a68 * dVar95;
  dVar299 = -(dVar230 * 10.0) * local_2a68 +
            local_2a68 * 10.0 * dVar54 * dVar96 +
            local_2978 * local_2a68 * -72.0 + dVar300 * dVar95 + (dVar228 * dVar301) / 2.0 + dVar299
  ;
  if ((dVar64 != 0.0) || (NAN(dVar64))) {
    local_2a70 = ((((((dVar213 * local_2a60 * -3.0438311688311688e-05 +
                       -(dVar210 * 0.005357142857142857) * local_2a60 +
                       -(dVar207 * local_2a60) / 7.71114500014776e+35 +
                       (dVar209 * local_2a60) / 7.633819549822504e+37 +
                       (dVar211 * local_2a60) / 1920.0 + (dVar214 * local_2a60) / 745472.0) -
                     (dVar215 * local_2a60) / 20643840.0) + (dVar216 * local_2a60) / 668467200.0) -
                   (dVar217 * local_2a60) / 24654643200.0) +
                  (dVar218 * local_2a60) / 1017328435200.0) -
                 (dVar219 * local_2a60) / 46351421276160.0) +
                 ((((((((((dVar220 * local_2a60) / 2.308410703872e+15 -
                         (dVar221 * local_2a60) / 1.24654178009088e+17) +
                        (dVar222 * local_2a60) / 7.250540450807808e+18) -
                       (dVar206 * local_2a60) / 4.517479587281633e+20) +
                      (dVar208 * local_2a60) / 3.000772247138819e+22) -
                     (local_2970 * local_2a60) / 2.116453759156243e+24) +
                    (dVar66 * local_2a60) / 1.5793369227989443e+26) -
                   (dVar205 * local_2a60) / 1.2429808430244664e+28) +
                  (dVar67 * local_2a60) / 1.0288727798616555e+30) -
                 (dVar212 * local_2a60) / 8.934630842486435e+31) +
                 (dVar68 * local_2a60) / 8.121312287389663e+33;
  }
  else {
    local_2a70 = local_2a68 * 48.0 * dVar223 + dVar299 * 24.0 * dVar92;
  }
  dVar302 = local_2980 * 1.5874010519681996;
  dVar303 = dVar302 * dVar31;
  dVar304 = dVar235 * dVar295;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2a78 = local_2a40;
  }
  else {
    local_2a78 = 0.0;
  }
  local_2a88 = ((((((((((((((dVar240 * local_2a78 * -4.6972703222703225e-06 +
                             dVar238 * -0.001530612244897959 * local_2a78 +
                             (dVar239 * local_2a78) / 9408.0 + (dVar241 * local_2a78) / 6150144.0) -
                           (dVar242 * local_2a78) / 210862080.0) +
                          (dVar243 * local_2a78) / 8272281600.0) -
                         (dVar244 * local_2a78) / 363245076480.0) +
                        (dVar245 * local_2a78) / 17589608644608.0) -
                       (dVar246 * local_2a78) / 929135308308480.0) +
                      (dVar247 * local_2a78) / 5.3093446189056e+16) -
                     (dVar248 * local_2a78) / 3.26018619408384e+18) +
                    (dVar249 * local_2a78) / 2.1394273287347896e+20) -
                   (dVar250 * local_2a78) / 1.493478751555308e+22) +
                  (dVar117 * local_2a78) / 1.1046592834779778e+24) -
                 (local_2988 * local_2a78) / 8.627661500560449e+25) +
                (dVar108 * local_2a78) / 7.093855011571925e+27) -
               (dVar237 * local_2a78) / 6.123970353448437e+29) +
               (dVar109 * local_2a78) / 5.53739330121543e+31;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2a80 = 0.0;
  }
  else {
    local_2a80 = local_2a40;
  }
  dVar305 = dVar139 * local_2a80 * 26880.0 +
            dVar132 * local_2a80 * -2880.0 +
            dVar130 * local_2a80 * 768.0 + local_2a80 * -1105920.0 * dVar135 + -(local_2a80 * 8.0);
  dVar306 = local_2a80 * dVar138;
  dVar307 = dVar133 * local_2a80 * 30720.0 +
            local_2990 * local_2a80 * 448.0 + -(dVar131 * local_2a80 * 5760.0);
  dVar308 = -(dVar258 * 2.0 * dVar137) * local_2a80 +
            dVar257 * 240.0 * local_2a80 * dVar143 +
            dVar131 * 24.0 * dVar307 +
            dVar255 * 72.0 * local_2a80 + dVar305 * dVar138 + (dVar253 * dVar306) / 2.0;
  if ((dVar106 == 0.0) && (!NAN(dVar106))) {
    local_2a88 = local_2a80 * 1.1428571428571428 * dVar144 +
                 local_2990 * 1.1428571428571428 * dVar308;
  }
  dVar309 = local_2a88 * 1.8171205928321397 * dVar26;
  dVar310 = dVar264 * dVar104;
  dVar311 = dVar234 * dVar295;
  dVar312 = dVar264 * dVar311;
  dVar313 = -(dVar263 * 0.010531842222222223) * dVar312 +
            dVar145 * 0.026329605555555555 * dVar310 +
            dVar309 * 0.026329605555555555 * dVar146 +
            -(dVar233 * 0.1728395061728395) * dVar304 +
            dVar303 * 0.018276169650205763 * dVar105 +
            local_2a70 * dVar101 * 0.43209876543209874 * dVar105 +
            local_2a58 * dVar63 + -((dVar204 * dVar295) / 5.0);
  dVar314 = dVar178 * 6.0 * dVar290 + -dVar292;
  dVar315 = dVar314 * local_29b0;
  dVar316 = dVar26 * 1.5874010519681996 * dVar31;
  dVar317 = dVar169 * 1.8171205928321397 * dVar316;
  dVar318 = dVar27 * 1.5874010519681996;
  dVar319 = dVar31 * local_2940;
  dVar320 = dVar318 * dVar319 * dVar171;
  dVar294 = dVar170 * 1.0814814814814815 * local_2a38 +
            -(dVar169 * local_2a38 * 1.0814814814814815) * dVar171 +
            dVar320 * 0.003755144032921811 +
            dVar317 * -0.005006858710562414 +
            dVar294 * 0.002381496723060509 + dVar167 * 0.4166666666666667 * dVar316;
  dVar321 = dVar281 * dVar294;
  dVar322 = dVar285 * local_2a38;
  dVar323 = -(dVar190 * 0.3111111111111111) * dVar295 +
            dVar27 * 0.04460577520576132 * dVar310 + (-dVar203 * dVar295) / 5.0;
  dVar324 = dVar314 * dVar173 +
            dVar20 * dVar323 +
            -(dVar178 * 6.0) * dVar322 +
            -(double)in_RDI[6] *
            (dVar315 * dVar173 + dVar20 * dVar313 + dVar292 * dVar147 + -(dVar178 * 6.0 * dVar293) +
            (dVar166 * dVar321) / 10.0) + dVar292 * dVar25 + (dVar231 * dVar294) / 10.0;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2a90 = 0.0;
  }
  else {
    local_2a90 = dVar10 * -0.36927938319101117 * dVar324;
  }
  if ((in_stack_00000008[2] != 0) && ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xc];
    *(double *)(in_stack_00000008[2] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2a90 + *(double *)(in_stack_00000008[2] + lVar5 * 8);
  }
  if (((in_stack_00000008[3] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 100);
    *(double *)(in_stack_00000008[3] + lVar5 * 8) =
         *(double *)(in_stack_00000008[3] + lVar5 * 8) + 0.0;
  }
  dVar3 = *in_R9;
  dVar4 = *in_R9;
  dVar325 = 1.0 / (dVar3 * dVar4);
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2a98 = (-dVar12 * dVar325) / 8.0;
  }
  else {
    local_2a98 = 0.0;
  }
  dVar326 = local_2940 * local_2a98;
  dVar327 = dVar15 * local_2a98;
  dVar328 = dVar326 + dVar326 + dVar327 * 9.0;
  dVar329 = dVar328 * dVar19;
  dVar330 = dVar179 * local_2a98;
  dVar331 = dVar20 * dVar302;
  dVar332 = dVar99 * 1.8171205928321397;
  dVar333 = dVar332 * dVar26 * dVar104;
  dVar334 = dVar327 * 6.0 * dVar178 + -dVar329;
  dVar335 = dVar334 * local_29b0;
  dVar336 = dVar99 * 1.5874010519681996;
  dVar337 = dVar336 * 1.8171205928321397;
  dVar338 = dVar26 * local_2940;
  dVar339 = dVar169 * local_2a98;
  dVar340 = dVar170 * 1.0814814814814815 * local_2a98 +
            -(dVar339 * 1.0814814814814815) * dVar171 +
            dVar169 * 0.36049382716049383 * 1.5874010519681996 * dVar332 * dVar26 +
            -(dVar337 * 0.27037037037037037 * dVar338 * dVar171);
  dVar341 = dVar281 * dVar340;
  dVar342 = dVar285 * local_2a98;
  dVar343 = dVar334 * dVar173 +
            -(dVar20 * 1.5874010519681996 * 0.06288822469135802) * dVar333 +
            -(dVar178 * 6.0) * dVar342 +
            -(double)in_RDI[6] *
            (dVar335 * dVar173 +
             -(dVar331 * 0.06288822469135802) * dVar333 +
             dVar329 * dVar147 + -(dVar178 * 6.0 * dVar330) + (dVar166 * dVar341) / 10.0) +
            dVar329 * dVar25 + (dVar231 * dVar340) / 10.0;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2aa0 = 0.0;
  }
  else {
    local_2aa0 = dVar10 * -0.36927938319101117 * dVar343;
  }
  if (((in_stack_00000008[4] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 2) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xd];
    *(double *)(in_stack_00000008[4] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2aa0 + *(double *)(in_stack_00000008[4] + lVar5 * 8);
  }
  dVar344 = local_29c0 * local_29c0;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2aa8 = (*in_RCX * (1.0 / dVar188) * dVar13) / 4.0;
  }
  else {
    local_2aa8 = 0.0;
  }
  dVar345 = (dVar15 * local_2aa8 * 9.0 +
            local_2940 * dVar344 * 18.0 + local_2aa8 * 2.0 * local_2940 + dVar344 * 2.0) * dVar19;
  dVar176 = dVar176 * dVar17;
  dVar16 = dVar16 * (1.0 / (dVar18 * dVar18));
  dVar18 = dVar15 * dVar15;
  dVar346 = dVar147 * dVar18;
  dVar347 = dVar267 * dVar15;
  dVar348 = dVar147 * local_2940;
  dVar39 = dVar39 * dVar39;
  dVar103 = (1.0 / dVar103) / dVar39;
  dVar349 = dVar194 * dVar194;
  dVar350 = (1.0 / dVar30) / dVar37;
  dVar351 = dVar28 * dVar350;
  dVar352 = dVar27 * dVar351;
  dVar36 = dVar35 * dVar36 * ((1.0 / dVar9) / (dVar37 * dVar188));
  dVar353 = dVar352 * 1.4711144691358025 + dVar36 * 0.18172100223395413;
  dVar354 = dVar189 * 1.5874010519681996;
  dVar355 = local_2a10 * 1.8171205928321397 * dVar262;
  dVar356 = dVar98 * dVar189 * 0.6468503111111111;
  dVar357 = dVar26 * dVar103;
  dVar358 = ((1.0 / dVar9) / dVar29) * 1.4422495703074083;
  dVar183 = dVar183 * dVar186;
  dVar24 = dVar24 * ((1.0 / dVar40) / dVar39);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2ab0 = 0.0;
  }
  else {
    local_2ab0 = (dVar185 * 0.006111111111111111 * dVar24 * local_2948 * dVar349 +
                 dVar23 * 0.024691358024691357 * dVar358 * dVar7 +
                 (dVar185 * dVar183 * local_2948 * dVar194) / 270.0) -
                 (dVar185 * dVar187 * local_2948 * dVar353) / 180.0;
  }
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2ab8 = local_2ab0;
  }
  else {
    local_2ab8 = 0.0;
  }
  dVar7 = local_2a00 * local_2a00;
  dVar112 = (1.0 / dVar126) / dVar112;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2ac0 = 0.0;
  }
  else {
    local_2ac0 = local_2ab0;
  }
  dVar40 = local_2a08 * local_2a08;
  dVar251 = dVar251 * dVar252;
  dVar126 = dVar136 * (1.0 / dVar132);
  dVar359 = dVar40 * dVar138;
  dVar136 = dVar136 * (1.0 / dVar139);
  dVar140 = local_2990 * dVar140;
  dVar256 = dVar130 * dVar256;
  dVar141 = dVar141 * (1.0 / dVar133);
  if ((dVar106 != 0.0) || (NAN(dVar106))) {
    local_2ac8 = -(dVar238 * 0.001530612244897959) * local_2ab8 +
                 -(dVar240 * 4.6972703222703225e-06) * local_2ab8 +
                 ((((((((((((dVar109 * local_2ab8) / 5.53739330121543e+31 -
                           (local_2988 * local_2ab8) / 8.627661500560449e+25) +
                          (dVar108 * local_2ab8) / 7.093855011571925e+27) -
                         (dVar237 * local_2ab8) / 6.123970353448437e+29) -
                        (dVar250 * local_2ab8) / 1.493478751555308e+22) +
                        (dVar117 * local_2ab8) / 1.1046592834779778e+24 +
                       (dVar247 * local_2ab8) / 5.3093446189056e+16) -
                      (dVar248 * local_2ab8) / 3.26018619408384e+18) +
                      (dVar249 * local_2ab8) / 2.1394273287347896e+20 +
                     (dVar245 * local_2ab8) / 17589608644608.0) -
                    (dVar246 * local_2ab8) / 929135308308480.0) -
                   (dVar242 * local_2ab8) / 210862080.0) + (dVar243 * local_2ab8) / 8272281600.0) -
                 (dVar244 * local_2ab8) / 363245076480.0) + (dVar241 * local_2ab8) / 6150144.0 +
                 (dVar239 * local_2ab8) / 9408.0 +
                 ((((dVar114 * 4.22754329004329e-05 * dVar7 +
                    ((dVar111 * 0.007653061224489796 * dVar7 +
                     ((((((((((((dVar128 * dVar7) / 2.614442878957712e+24 -
                               (dVar129 * dVar7) / 2.0268157175919785e+26) +
                              (dVar110 * dVar7) / 1.6551271225536316e+28) -
                             (dVar112 * dVar7) / 1.4198444362090846e+30) +
                            (dVar119 * dVar7) / 21367357440.0) - (dVar120 * dVar7) / 925768876032.0)
                          + (dVar121 * dVar7) / 44244538490880.0) -
                         (dVar122 * dVar7) / 2.308410703872e+15) +
                        (dVar123 * dVar7) / 1.304074477633536e+17) -
                       (dVar124 * dVar7) / 7.923804921239962e+18) +
                      (dVar125 * dVar7) / 5.149926729501062e+20) -
                     (dVar127 * dVar7) / 3.5634170434773477e+22)) - (dVar113 * dVar7) / 1344.0)) -
                   (dVar115 * dVar7) / 559104.0) + (dVar116 * dVar7) / 16220160.0) -
                 (dVar118 * dVar7) / 551485440.0);
  }
  else {
    local_2ac8 = local_2990 * 1.1428571428571428 *
                 (-(dVar258 * 2.0) * dVar137 * local_2ac0 +
                 dVar258 * 4.0 * dVar252 * dVar40 +
                 -dVar141 * dVar359 +
                 -(dVar142 * 480.0 * dVar40) * dVar138 +
                 dVar257 * 240.0 * local_2ac0 * dVar143 +
                 dVar54 * 240.0 * dVar40 * dVar143 +
                 dVar131 * 24.0 *
                 (dVar132 * dVar40 * 153600.0 +
                 dVar130 * dVar40 * -17280.0 +
                 dVar40 * 448.0 +
                 local_2ac0 * 30720.0 * dVar133 +
                 local_2ac0 * 448.0 * local_2990 + -(local_2ac0 * 5760.0 * dVar131)) +
                 dVar255 * 72.0 * local_2ac0 +
                 dVar256 * 144.0 * local_2a08 +
                 dVar140 * 144.0 * dVar40 +
                 -(dVar126 * 1.5) * dVar359 +
                 (dVar131 * dVar40 * -11520.0 +
                 local_2990 * dVar40 * 1536.0 +
                 local_2ac0 * -8.0 +
                 -(dVar40 * 8847360.0) * dVar134 +
                 dVar40 * 161280.0 * dVar133 +
                 local_2ac0 * 26880.0 * dVar139 +
                 -(local_2ac0 * 1105920.0) * dVar135 +
                 local_2ac0 * 768.0 * dVar130 + -(local_2ac0 * 2880.0 * dVar132)) * dVar138 +
                 dVar251 * dVar254 + (dVar253 * local_2ac0 * dVar138) / 2.0 +
                 (dVar136 * dVar359) / 4.0) +
                 local_2ac0 * 1.1428571428571428 * dVar144 +
                 local_2a08 * 2.2857142857142856 * dVar259;
  }
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2ad0 = local_2ab0;
  }
  else {
    local_2ad0 = 0.0;
  }
  dVar7 = local_29e8 * local_29e8;
  dVar70 = (1.0 / dVar71) / dVar70;
  dVar40 = local_29f0 * local_29f0;
  dVar225 = local_2978 * dVar225;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2ad8 = 0.0;
  }
  else {
    local_2ad8 = local_2ab0;
  }
  dVar71 = dVar92 * 768.0 * dVar40;
  dVar359 = dVar224 * 256.0 * local_2ad8;
  dVar226 = dVar226 * dVar227;
  dVar360 = 1.0 / dVar93;
  dVar361 = dVar94 * dVar360;
  dVar94 = dVar94 * ((1.0 / dVar93) / dVar92);
  if ((dVar64 != 0.0) || (NAN(dVar64))) {
    local_2ae0 = ((((((((dVar67 * local_2ad0) / 1.0288727798616555e+30 -
                       (dVar212 * local_2ad0) / 8.934630842486435e+31) +
                       (dVar68 * local_2ad0) / 8.121312287389663e+33 +
                      (dVar66 * local_2ad0) / 1.5793369227989443e+26) -
                     (dVar205 * local_2ad0) / 1.2429808430244664e+28) -
                    (dVar206 * local_2ad0) / 4.517479587281633e+20) +
                   (dVar208 * local_2ad0) / 3.000772247138819e+22) -
                  (local_2970 * local_2ad0) / 2.116453759156243e+24) -
                 (dVar221 * local_2ad0) / 1.24654178009088e+17) +
                 (dVar222 * local_2ad0) / 7.250540450807808e+18 +
                 (dVar218 * local_2ad0) / 1017328435200.0 +
                 ((-(dVar210 * 0.005357142857142857) * local_2ad0 +
                   ((-(dVar213 * 3.0438311688311688e-05) * local_2ad0 +
                     (((-dVar219 * local_2ad0) / 46351421276160.0 +
                       (dVar220 * local_2ad0) / 2.308410703872e+15 +
                      (dVar216 * local_2ad0) / 668467200.0) - (dVar217 * local_2ad0) / 24654643200.0
                     ) + (dVar214 * local_2ad0) / 745472.0) - (dVar215 * local_2ad0) / 20643840.0) +
                  (dVar211 * local_2ad0) / 1920.0) - (dVar207 * local_2ad0) / 7.71114500014776e+35)
                 + (dVar209 * local_2ad0) / 7.633819549822504e+37 +
                 -(dVar88 * 1.0330674055506187e-21) * dVar7 +
                 dVar74 * 6.419508807886076e-20 * dVar7 +
                 ((-(dVar86 * 9.963564958965524e-15) * dVar7 +
                   -(dVar72 * 5.2947108149957596e-33) * dVar7 +
                   dVar78 * 4.588885732696935e-31 * dVar7 +
                   dVar73 * 2.9767152251494278e-27 * dVar7 +
                   -((dVar91 * dVar7) / 2.638135332978604e+28) + (dVar85 * dVar7) / 2207210536960.0
                  + (dVar87 * dVar7) / 4.98616712036352e+15) -
                 (dVar69 * dVar7) / 2.68538535215104e+17) + (dVar89 * dVar7) / 6.413496239867403e+22
                 + -(dVar70 * 6.156813072833613e-37) * dVar7 +
                   -(dVar84 * 1.8676367771303596e-11) * dVar7 +
                   dVar83 * 6.895252899056353e-10 * dVar7 +
                   ((dVar81 * 6.297278025793651e-07 * dVar7 +
                    -(dVar80 * 1.475575206043956e-05) * dVar7 +
                    dVar79 * 0.0002739448051948052 * dVar7 +
                    -(dVar77 * 0.0036458333333333334) * dVar7 +
                    dVar76 * 0.026785714285714284 * dVar7 +
                    (-dVar90 * dVar7) / 4.5123912079969836e+24) - (dVar82 * dVar7) / 44564480.0) +
                   (dVar75 * dVar7) / 1.7135877778106135e+34;
  }
  else {
    local_2ae0 = (-(dVar230 * 10.0) * local_2ad8 +
                 -(dVar360 * 5.0 * dVar40) * dVar95 +
                 local_2ad8 * 10.0 * dVar54 * dVar96 +
                 local_2978 * local_2ad8 * -72.0 +
                 dVar40 * -72.0 +
                 -(dVar361 * 1.5) * dVar40 * dVar95 +
                 (((dVar40 * 40.0 + local_2978 * local_2ad8 * 40.0) - dVar71) - dVar359) * dVar95 +
                 dVar226 * dVar229 + (dVar228 * local_2ad8 * dVar95) / 2.0 +
                 (dVar94 * dVar40 * dVar95) / 4.0 + dVar71 + dVar359) * 24.0 * dVar92 +
                 local_2ad8 * 48.0 * dVar223 + dVar40 * 48.0 * dVar97 + dVar225 * 96.0 * local_29f0;
  }
  dVar7 = local_29d0 * local_29d0;
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2ae8 = local_2ab0;
  }
  else {
    local_2ae8 = 0.0;
  }
  dVar43 = (1.0 / dVar52) / dVar43;
  local_2af8 = ((((((((((((dVar45 * dVar7) / 6.0 - (dVar182 * local_2ae8) / 18.0) -
                        (dVar46 * dVar7) / 48.0) + (dVar195 * local_2ae8) / 240.0 +
                       (dVar48 * dVar7) / 640.0) - (dVar196 * local_2ae8) / 4480.0) -
                     (dVar49 * dVar7) / 11520.0) + (dVar197 * local_2ae8) / 103680.0 +
                    (dVar50 * dVar7) / 258048.0) - (dVar198 * local_2ae8) / 2838528.0) -
                  (dVar51 * dVar7) / 6881280.0) + (dVar199 * local_2ae8) / 89456640.0 +
                 (dVar53 * dVar7) / 212336640.0) - (dVar44 * local_2ae8) / 3185049600.0) -
               (dVar43 * dVar7) / 7431782400.0) + (local_2958 * local_2ae8) / 126340300800.0;
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2af0 = 0.0;
  }
  else {
    local_2af0 = local_2ab0;
  }
  dVar7 = dVar57 * dVar57;
  dVar40 = (1.0 / dVar7) / local_2960;
  dVar52 = local_29d8 * local_29d8;
  dVar71 = dVar59 * dVar181;
  dVar93 = 1.0 / dVar7;
  dVar57 = (1.0 / dVar7) / dVar57;
  if ((dVar41 == 0.0) && (!NAN(dVar41))) {
    local_2af8 = -(local_2960 * 2.6666666666666665) *
                 (local_2960 * 2.0 *
                  (-(dVar55 * local_2af0) * dVar59 +
                  -(dVar200 * 4.0) * local_2af0 +
                  -(dVar58 * dVar52) * dVar59 +
                  -(dVar52 * 4.0) * dVar60 +
                  dVar93 * -2.0 * dVar52 * dVar59 + (dVar181 * local_2af0 * dVar59) / 2.0 +
                  (dVar57 * dVar52 * dVar59) / 4.0) +
                 local_29d8 * 4.0 * dVar201 +
                 local_2af0 * 2.0 * dVar61 +
                 -dVar47 * local_2af0 + dVar71 * 2.0 * dVar52 + (-(dVar40 * dVar52) * dVar59) / 2.0)
                 + local_2af0 * -2.6666666666666665 * dVar56 +
                   -(local_29d8 * 5.333333333333333 * dVar202);
  }
  dVar39 = (1.0 / dVar62) / dVar39;
  local_2968 = local_2968 * dVar39;
  dVar7 = local_2980 * dVar232 * 1.8171205928321397;
  dVar52 = local_29f8 * dVar101 * 1.8171205928321397;
  dVar62 = (-(dVar16 * 54.0) * dVar18 * dVar344 +
           dVar176 * 12.0 * dVar175 +
           local_2940 * dVar344 * 12.0 * dVar178 + dVar15 * local_2aa8 * 6.0 * dVar178) - dVar345;
  local_2a18 = local_2a18 * local_2a18;
  local_2b08 = dVar23 * 0.024691358024691357 * dVar358 * local_2948;
  local_2b00 = local_2b08;
  if ((dVar150 == 0.0) && (!NAN(dVar150))) {
    local_2b00 = 0.0;
  }
  local_2b10 = (((((((((((((1.0 / dVar152) * local_2a18) / 6.0 -
                         ((1.0 / dVar270) * local_2b00) / 18.0) - (dVar153 * local_2a18) / 48.0) +
                        (dVar184 * local_2b00) / 240.0 + ((1.0 / dVar154) * local_2a18) / 640.0) -
                      (dVar271 * local_2b00) / 4480.0) - (dVar155 * local_2a18) / 11520.0) +
                     (dVar272 * local_2b00) / 103680.0 + (dVar156 * local_2a18) / 258048.0) -
                   (dVar273 * local_2b00) / 2838528.0) - (dVar157 * local_2a18) / 6881280.0) +
                  (dVar274 * local_2b00) / 89456640.0 + ((1.0 / dVar158) * local_2a18) / 212336640.0
                 ) - (dVar275 * local_2b00) / 3185049600.0) -
               (((1.0 / dVar158) / dVar151) * local_2a18) / 7431782400.0) +
               (local_29a0 * local_2b00) / 126340300800.0;
  if ((dVar150 != 0.0) || (NAN(dVar150))) {
    local_2b08 = 0.0;
  }
  dVar23 = dVar161 * dVar161;
  dVar150 = local_2a20 * local_2a20;
  if ((dVar149 == 0.0) && (!NAN(dVar149))) {
    local_2b10 = -(local_29a8 * 2.6666666666666665) *
                 (local_29a8 * 2.0 *
                  (-(dVar159 * local_2b08) * dVar163 +
                  -(local_29a8 * dVar164 * 4.0) * local_2b08 +
                  -(dVar162 * dVar150) * dVar163 +
                  -(dVar150 * 4.0) * dVar164 +
                  (1.0 / dVar23) * -2.0 * dVar150 * dVar163 + (dVar276 * local_2b08 * dVar163) / 2.0
                  + (((1.0 / dVar23) / dVar161) * dVar150 * dVar163) / 4.0) +
                 local_2a20 * 4.0 * dVar277 +
                 local_2b08 * 2.0 * dVar165 +
                 -(dVar163 * dVar162) * local_2b08 +
                 dVar163 * dVar276 * 2.0 * dVar150 +
                 (-(((1.0 / dVar23) / local_29a8) * dVar150) * dVar163) / 2.0) +
                 local_2b08 * -2.6666666666666665 * dVar160 +
                 -(local_2a20 * 5.333333333333333 * dVar278);
  }
  dVar172 = (1.0 / dVar280) / dVar172;
  dVar23 = dVar352 * 0.2716049382716049 +
           ((dVar98 * dVar189 * 4.444444444444445 + -(dVar351 * 1.2222222222222223)) *
            1.8171205928321397 * dVar26) / 4.0;
  dVar23 = dVar170 * 1.0814814814814815 * local_2aa8 +
           dVar169 * 2.162962962962963 * dVar344 +
           -(dVar169 * local_2aa8 * 1.0814814814814815) * dVar171 +
           dVar283 * 2.162962962962963 * local_29c0 +
           -(dVar282 * 2.162962962962963 * local_29c0) * dVar171 +
           -(dVar23 * local_2940 * 1.0814814814814815) * dVar171 +
           dVar169 * 1.4419753086419753 * dVar23 +
           dVar282 * dVar282 * 1.4419753086419753 +
           dVar36 * 0.05715592135345222 + dVar168 * 4.074074074074074 * dVar351;
  dVar36 = dVar25 * dVar18;
  dVar98 = dVar191 * dVar15;
  dVar149 = dVar25 * local_2940;
  dVar287 = dVar287 * dVar234;
  dVar33 = dVar33 * dVar103;
  dVar150 = dVar268 * dVar281;
  dVar151 = dVar148 * dVar172;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2b18 = 0.0;
  }
  else {
    local_2b18 = -(dVar10 * 0.36927938319101117) *
                 (-(dVar151 * 0.09) * dVar193 * dVar193 +
                  dVar62 * dVar173 +
                  dVar20 * (-(dVar190 * 0.3111111111111111) * dVar353 +
                           dVar33 * 0.43555555555555553 * dVar349 +
                           -(dVar287 * 0.6222222222222222) * dVar194 +
                           (dVar352 * 0.625223649382716 +
                           -((dVar351 * 0.11603759851851851 + dVar356) * 0.5555555555555556 *
                             1.8171205928321397 * dVar26)) * 0.7777777777777778 * dVar104 +
                           dVar39 * 0.24 * dVar349 + -((dVar203 * dVar353) / 5.0)) +
                  -(dVar178 * 6.0) * dVar285 * local_2aa8 +
                  -(dVar178 * 12.0) * dVar149 * dVar344 +
                  -(dVar178 * 12.0) * dVar98 * local_29c0 +
                  dVar16 * 54.0 * dVar36 * dVar344 +
                  dVar177 * 2.0 * dVar191 +
                  -(dVar176 * 12.0) * dVar286 +
                  -(double)in_RDI[6] *
                  (-(dVar166 * 0.09) * dVar172 * dVar193 * dVar193 +
                   dVar148 * local_2b10 * dVar173 +
                   dVar268 * local_2a28 * 2.0 * dVar173 +
                   dVar62 * local_29b0 * dVar173 +
                   dVar20 * (-(dVar52 * 0.345679012345679) * dVar236 +
                            -(dVar233 * 0.1728395061728395) * dVar235 * dVar353 +
                            -(dVar7 * 0.345679012345679) * dVar236 +
                            local_2968 * 0.24 * dVar349 +
                            local_2af8 * dVar63 +
                            ((-(local_29e0 * dVar203 * 0.4) * dVar194 +
                             local_2ae0 * dVar101 * 0.43209876543209874 * dVar105 +
                             local_29f8 * dVar232 * 0.8641975308641975 * dVar105 +
                             local_2ac8 * 1.8171205928321397 * dVar26 * 0.026329605555555555 *
                             dVar146 + dVar233 * 0.2419753086419753 * dVar357 * dVar349 +
                                       local_2980 * (dVar351 * 0.41356361037037037 + -dVar356) *
                                       0.43209876543209874 * dVar105 +
                                       -(dVar355 * 0.021063684444444446) * dVar266 +
                                       -(dVar260 * 0.14042456296296296) * dVar261 +
                                       dVar263 * 0.056169825185185186 * dVar354 * dVar265 +
                                       dVar145 * 0.25744503209876546 * dVar28 * dVar350 * dVar104 +
                                       dVar263 * 0.01474457911111111 * dVar264 * dVar103 * dVar349 +
                                       -(dVar263 * 0.010531842222222223 *
                                        dVar264 * dVar234 * dVar353)) - (dVar204 * dVar353) / 5.0))
                   + -(dVar178 * 6.0) * dVar179 * local_2aa8 +
                     -(dVar178 * 12.0) * dVar348 * dVar344 +
                     -(dVar178 * 12.0) * dVar347 * local_29c0 +
                     dVar16 * 54.0 * dVar346 * dVar344 +
                     dVar177 * 2.0 * dVar267 + dVar345 * dVar147 + -(dVar176 * 12.0 * dVar180) +
                   (dVar269 * dVar284) / 5.0 + (dVar279 * dVar284) / 5.0 +
                  (dVar166 * dVar281 * dVar23) / 10.0) + dVar345 * dVar25 +
                  (dVar150 * dVar193) / 5.0 + (dVar231 * dVar23) / 10.0) +
                 ((local_2938 * dVar99 * 0.9847450218426964 * dVar32) / 12.0 -
                 (dVar100 * 0.9847450218426964 * dVar288) / 4.0);
  }
  if ((in_stack_00000008[5] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x6c);
    *(double *)(in_stack_00000008[5] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2b18 + local_2a30 * 4.0 +
         *(double *)(in_stack_00000008[5] + lVar5 * 8);
  }
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2b20 = (-(1.0 / dVar29) * dVar13) / 8.0;
  }
  else {
    local_2b20 = 0.0;
  }
  dVar289 = dVar289 * local_29c0;
  dVar13 = (dVar15 * local_2b20 * 9.0 +
           dVar289 * 18.0 +
           local_29c0 * local_2a38 + local_29c0 * local_2a38 + local_2940 * local_2b20 * 2.0) *
           dVar19;
  dVar291 = dVar291 * dVar17;
  dVar23 = dVar16 * dVar147;
  dVar28 = dVar18 * local_2a38 * local_29c0;
  dVar29 = dVar178 * dVar147;
  dVar32 = dVar313 * dVar15;
  dVar192 = dVar35 * dVar2 * 1.2599210498948732 * dVar192;
  dVar62 = dVar27 * -0.40121303703703703 * dVar354 + -(dVar192 * 0.057385579652827624);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2b28 = 0.0;
  }
  else {
    local_2b28 = (dVar185 * 0.006111111111111111 * dVar24 * dVar296 * dVar194 +
                 (dVar185 * dVar183 * dVar296) / 540.0) -
                 (dVar185 * dVar187 * local_2948 * dVar62) / 180.0;
  }
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2b30 = local_2b28;
  }
  else {
    local_2b30 = 0.0;
  }
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2b38 = 0.0;
  }
  else {
    local_2b38 = local_2b28;
  }
  dVar299 = local_2978 * dVar299;
  dVar148 = dVar92 * local_2a68 * 768.0 * local_29f0;
  dVar152 = dVar224 * 256.0 * local_2b38;
  dVar300 = dVar300 * dVar227;
  if ((dVar64 != 0.0) || (NAN(dVar64))) {
    local_2b40 = ((((((((-(dVar205 * local_2b30) / 1.2429808430244664e+28 +
                        (dVar67 * local_2b30) / 1.0288727798616555e+30) -
                       (dVar212 * local_2b30) / 8.934630842486435e+31) +
                       (dVar68 * local_2b30) / 8.121312287389663e+33 +
                      (dVar208 * local_2b30) / 3.000772247138819e+22) -
                     (local_2970 * local_2b30) / 2.116453759156243e+24) +
                    (dVar66 * local_2b30) / 1.5793369227989443e+26) -
                   (dVar221 * local_2b30) / 1.24654178009088e+17) +
                  (dVar222 * local_2b30) / 7.250540450807808e+18) -
                 (dVar206 * local_2b30) / 4.517479587281633e+20) +
                 (dVar218 * local_2b30) / 1017328435200.0 +
                 ((dVar213 * local_2b30 * -3.0438311688311688e-05 +
                   -(dVar210 * 0.005357142857142857) * local_2b30 +
                   ((((-(dVar219 * local_2b30) / 46351421276160.0 +
                      (dVar220 * local_2b30) / 2.308410703872e+15) -
                     (dVar215 * local_2b30) / 20643840.0) + (dVar216 * local_2b30) / 668467200.0) -
                   (dVar217 * local_2b30) / 24654643200.0) + (dVar211 * local_2b30) / 1920.0 +
                  (dVar214 * local_2b30) / 745472.0) - (dVar207 * local_2b30) / 7.71114500014776e+35
                 ) + (dVar209 * local_2b30) / 7.633819549822504e+37 +
                 dVar73 * local_2a60 * 2.9767152251494278e-27 * local_29e8 +
                 ((-(dVar88 * local_2a60 * 1.0330674055506187e-21) * local_29e8 +
                   dVar74 * local_2a60 * 6.419508807886076e-20 * local_29e8 +
                   ((-(dVar86 * local_2a60 * 9.963564958965524e-15) * local_29e8 +
                     dVar72 * local_2a60 * -5.2947108149957596e-33 * local_29e8 +
                     -(dVar84 * local_2a60 * 1.8676367771303596e-11 * local_29e8) +
                     (dVar85 * local_2a60 * local_29e8) / 2207210536960.0 +
                    (dVar87 * local_2a60 * local_29e8) / 4.98616712036352e+15) -
                   (dVar69 * local_2a60 * local_29e8) / 2.68538535215104e+17) +
                  (dVar89 * local_2a60 * local_29e8) / 6.413496239867403e+22) -
                 (dVar90 * local_2a60 * local_29e8) / 4.5123912079969836e+24) +
                 dVar83 * local_2a60 * 6.895252899056353e-10 * local_29e8 +
                 ((dVar81 * local_2a60 * 6.297278025793651e-07 * local_29e8 +
                  -(dVar80 * local_2a60 * 1.475575206043956e-05) * local_29e8 +
                  dVar79 * local_2a60 * 0.0002739448051948052 * local_29e8 +
                  -(dVar77 * local_2a60 * 0.0036458333333333334) * local_29e8 +
                  dVar76 * local_2a60 * 0.026785714285714284 * local_29e8 +
                  -(dVar70 * local_2a60 * 6.156813072833613e-37) * local_29e8 +
                  dVar78 * local_2a60 * 4.588885732696935e-31 * local_29e8 +
                  (-(dVar91 * local_2a60) * local_29e8) / 2.638135332978604e+28 +
                  (dVar75 * local_2a60 * local_29e8) / 1.7135877778106135e+34) -
                 (dVar82 * local_2a60 * local_29e8) / 44564480.0);
  }
  else {
    local_2b40 = dVar299 * 48.0 * local_29f0 +
                 local_2b38 * 48.0 * dVar223 +
                 dVar92 * 24.0 *
                 (-(dVar230 * 10.0) * local_2b38 +
                 -(dVar360 * local_29f0 * 5.0) * dVar301 +
                 local_2b38 * 10.0 * dVar54 * dVar96 +
                 local_2978 * local_2b38 * -72.0 +
                 local_29f0 * local_2a68 * -72.0 +
                 -(dVar361 * 1.5) * dVar301 * local_29f0 +
                 (((local_29f0 * local_2a68 * 40.0 + local_2978 * local_2b38 * 40.0) - dVar148) -
                 dVar152) * dVar95 + (dVar300 * dVar229) / 2.0 + (dVar226 * dVar301) / 2.0 +
                 (dVar228 * local_2b38 * dVar95) / 2.0 + (dVar94 * dVar301 * local_29f0) / 4.0 +
                 dVar148 + dVar152) +
                 local_2a68 * 48.0 * dVar225 + local_2a68 * 48.0 * local_29f0 * dVar97;
  }
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2b48 = local_2b28;
  }
  else {
    local_2b48 = 0.0;
  }
  local_2b58 = ((((((((((((dVar45 * local_2a48 * local_29d0) / 6.0 - (dVar182 * local_2b48) / 18.0)
                        - (dVar46 * local_2a48 * local_29d0) / 48.0) +
                        (dVar195 * local_2b48) / 240.0 + (dVar48 * local_2a48 * local_29d0) / 640.0)
                      - (dVar196 * local_2b48) / 4480.0) -
                     (dVar49 * local_2a48 * local_29d0) / 11520.0) +
                     (dVar197 * local_2b48) / 103680.0 +
                    (dVar50 * local_2a48 * local_29d0) / 258048.0) -
                   (dVar198 * local_2b48) / 2838528.0) -
                  (dVar51 * local_2a48 * local_29d0) / 6881280.0) +
                  (dVar199 * local_2b48) / 89456640.0 +
                 (dVar53 * local_2a48 * local_29d0) / 212336640.0) -
                (dVar44 * local_2b48) / 3185049600.0) -
               (dVar43 * local_2a48 * local_29d0) / 7431782400.0) +
               (local_2958 * local_2b48) / 126340300800.0;
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2b50 = 0.0;
  }
  else {
    local_2b50 = local_2b28;
  }
  if ((dVar41 == 0.0) && (!NAN(dVar41))) {
    local_2b58 = -(local_2b50 * 2.6666666666666665) * dVar56 +
                 -(local_2960 * 2.6666666666666665) *
                 (local_2960 * 2.0 *
                  (-(dVar55 * local_2b50) * dVar59 +
                  -(dVar200 * 4.0) * local_2b50 +
                  -(dVar58 * local_29d8) * dVar59 * local_2a50 +
                  -(local_29d8 * dVar60 * 4.0) * local_2a50 +
                  dVar93 * local_2a50 * -2.0 * dVar59 * local_29d8 +
                  (dVar181 * local_2b50 * dVar59) / 2.0 +
                  (dVar57 * local_2a50 * dVar59 * local_29d8) / 4.0) +
                 local_29d8 * 2.0 * dVar297 +
                 local_2a50 * 2.0 * dVar201 +
                 local_2b50 * 2.0 * dVar61 +
                 -dVar47 * local_2b50 +
                 dVar71 * 2.0 * local_2a50 * local_29d8 +
                 (-(dVar40 * local_29d8) * dVar59 * local_2a50) / 2.0) +
                 local_2a50 * -2.6666666666666665 * dVar202 +
                 -(local_29d8 * 2.6666666666666665 * dVar298);
  }
  dVar262 = local_2a88 * 1.8171205928321397 * dVar262;
  dVar148 = local_2a70 * dVar101 * 1.8171205928321397;
  dVar152 = dVar295 * dVar194;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2b60 = local_2b28;
  }
  else {
    local_2b60 = 0.0;
  }
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2b68 = 0.0;
  }
  else {
    local_2b68 = local_2b28;
  }
  dVar305 = dVar305 * dVar252;
  dVar153 = dVar306 * local_2a08;
  dVar307 = dVar130 * dVar307;
  if ((dVar106 != 0.0) || (NAN(dVar106))) {
    local_2b70 = -(dVar238 * 0.001530612244897959) * local_2b60 +
                 ((dVar240 * local_2b60 * -4.6972703222703225e-06 +
                   ((((((((((-(local_2988 * local_2b60) / 8.627661500560449e+25 +
                            (dVar108 * local_2b60) / 7.093855011571925e+27) -
                           (dVar237 * local_2b60) / 6.123970353448437e+29) +
                           (dVar109 * local_2b60) / 5.53739330121543e+31 +
                          (dVar249 * local_2b60) / 2.1394273287347896e+20) -
                         (dVar250 * local_2b60) / 1.493478751555308e+22) +
                        (dVar117 * local_2b60) / 1.1046592834779778e+24) -
                       (dVar246 * local_2b60) / 929135308308480.0) +
                      (dVar247 * local_2b60) / 5.3093446189056e+16) -
                     (dVar248 * local_2b60) / 3.26018619408384e+18) +
                    (dVar243 * local_2b60) / 8272281600.0) - (dVar244 * local_2b60) / 363245076480.0
                   ) + (dVar245 * local_2b60) / 17589608644608.0 +
                  (dVar241 * local_2b60) / 6150144.0) - (dVar242 * local_2b60) / 210862080.0) +
                 (dVar239 * local_2b60) / 9408.0 +
                 ((((dVar114 * local_2a78 * 4.22754329004329e-05 * local_2a00 +
                    ((dVar111 * local_2a78 * 0.007653061224489796 * local_2a00 +
                     (((((((((((-(dVar120 * local_2a78) * local_2a00) / 925768876032.0 +
                              (dVar121 * local_2a78 * local_2a00) / 44244538490880.0) -
                             (dVar122 * local_2a78 * local_2a00) / 2.308410703872e+15) +
                            (dVar123 * local_2a78 * local_2a00) / 1.304074477633536e+17) -
                           (dVar124 * local_2a78 * local_2a00) / 7.923804921239962e+18) +
                          (dVar125 * local_2a78 * local_2a00) / 5.149926729501062e+20) -
                         (dVar127 * local_2a78 * local_2a00) / 3.5634170434773477e+22) +
                        (dVar128 * local_2a78 * local_2a00) / 2.614442878957712e+24) -
                       (dVar129 * local_2a78 * local_2a00) / 2.0268157175919785e+26) +
                      (dVar110 * local_2a78 * local_2a00) / 1.6551271225536316e+28) -
                     (dVar112 * local_2a78 * local_2a00) / 1.4198444362090846e+30)) -
                    (dVar113 * local_2a78 * local_2a00) / 1344.0)) -
                   (dVar115 * local_2a78 * local_2a00) / 559104.0) +
                  (dVar116 * local_2a78 * local_2a00) / 16220160.0) -
                 (dVar118 * local_2a78 * local_2a00) / 551485440.0) +
                 (dVar119 * local_2a78 * local_2a00) / 21367357440.0;
  }
  else {
    local_2b70 = local_2990 * 1.1428571428571428 *
                 (-(dVar258 * 2.0) * dVar137 * local_2b68 +
                 dVar258 * 4.0 * dVar252 * local_2a80 * local_2a08 +
                 -dVar141 * dVar153 +
                 -(dVar142 * local_2a80 * 480.0) * dVar254 +
                 dVar257 * 240.0 * local_2b68 * dVar143 +
                 dVar54 * local_2a08 * 240.0 * local_2a80 * dVar143 +
                 dVar131 * 24.0 *
                 (dVar133 * local_2b68 * 30720.0 +
                 dVar131 * local_2b68 * -5760.0 +
                 local_2990 * local_2b68 * 448.0 +
                 local_2a08 * local_2a80 * 448.0 +
                 dVar130 * local_2a80 * -17280.0 * local_2a08 +
                 dVar132 * local_2a80 * 153600.0 * local_2a08) +
                 dVar307 * 72.0 * local_2a08 +
                 dVar255 * 72.0 * local_2b68 +
                 dVar256 * 72.0 * local_2a80 +
                 dVar140 * 144.0 * local_2a08 * local_2a80 +
                 -(dVar126 * 1.5) * dVar153 +
                 (dVar139 * local_2b68 * 26880.0 +
                 dVar132 * local_2b68 * -2880.0 +
                 dVar130 * local_2b68 * 768.0 +
                 local_2b68 * -8.0 +
                 -(dVar134 * local_2a80 * 8847360.0) * local_2a08 +
                 -(local_2b68 * 1105920.0) * dVar135 +
                 dVar133 * local_2a80 * 161280.0 * local_2a08 +
                 local_2990 * local_2a80 * 1536.0 * local_2a08 +
                 -(dVar131 * local_2a80 * 11520.0 * local_2a08)) * dVar138 +
                 (dVar305 * dVar254) / 2.0 + (dVar251 * dVar306) / 2.0 +
                 (dVar253 * local_2b68 * dVar138) / 2.0 + (dVar136 * dVar153) / 4.0) +
                 local_2b68 * 1.1428571428571428 * dVar144 +
                 local_2a80 * 1.1428571428571428 * dVar259 +
                 local_2a08 * 1.1428571428571428 * dVar308;
  }
  dVar153 = (dVar291 * 6.0 * dVar175 +
            dVar15 * local_2b20 * 6.0 * dVar178 +
            dVar289 * 12.0 * dVar178 + dVar176 * 6.0 * dVar290 + -(dVar16 * 54.0 * dVar28)) - dVar13
  ;
  dVar154 = dVar26 * 1.5874010519681996 * dVar189;
  dVar154 = dVar170 * 1.0814814814814815 * local_2b20 +
            dVar283 * 1.0814814814814815 * local_2a38 +
            dVar169 * local_2a38 * 2.162962962962963 * local_29c0 +
            -(dVar169 * local_2b20 * 1.0814814814814815) * dVar171 +
            -(dVar282 * local_2a38 * 1.0814814814814815) * dVar171 +
            dVar318 * dVar319 * local_29c0 * -0.003755144032921811 +
            dVar318 * dVar31 * local_29c0 * dVar171 * 0.003755144032921811 +
            dVar318 * dVar189 * local_2940 * dVar171 * -0.010013717421124828 +
            dVar169 * 1.8171205928321397 * dVar154 * 0.013351623228166439 +
            dVar282 * 1.8171205928321397 * dVar316 * -0.005006858710562414 +
            dVar192 * -0.01905197378448407 + -(dVar167 * 1.1111111111111112 * dVar154);
  dVar155 = dVar16 * dVar25;
  dVar156 = dVar178 * dVar25;
  dVar157 = dVar323 * dVar15;
  dVar158 = dVar314 * dVar281;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2b78 = 0.0;
  }
  else {
    local_2b78 = -(dVar10 * 0.36927938319101117) *
                 (-(dVar151 * 0.09) * dVar294 * dVar193 +
                  dVar153 * dVar173 +
                  dVar20 * (-(dVar190 * 0.3111111111111111) * dVar62 +
                           dVar33 * 0.43555555555555553 * dVar152 +
                           -(dVar287 * 0.3111111111111111) * dVar295 +
                           -(dVar318 * 0.017842310082304528 * dVar31 * dVar234) * dVar194 +
                           -(dVar27 * 0.11894873388203017) * dVar354 * dVar104 +
                           dVar39 * dVar295 * 0.24 * dVar194 + -((dVar203 * dVar62) / 5.0)) +
                  -(dVar178 * 6.0) * dVar157 * local_29c0 +
                  dVar177 * dVar323 +
                  -(dVar178 * 6.0) * dVar285 * local_2b20 +
                  -(dVar156 * 12.0) * dVar289 +
                  -(dVar178 * 6.0) * dVar98 * local_2a38 +
                  dVar155 * 54.0 * dVar28 +
                  -(dVar176 * 6.0) * dVar322 +
                  dVar292 * dVar191 +
                  -(dVar291 * 6.0) * dVar286 +
                  -(double)in_RDI[6] *
                  (-(dVar166 * 0.09) * dVar172 * dVar294 * dVar193 +
                   dVar314 * local_2a28 * dVar173 +
                   dVar153 * local_29b0 * dVar173 +
                   dVar20 * (local_29f8 * 1.5874010519681996 * dVar31 * 0.018276169650205763 *
                             dVar105 + -(dVar148 * 0.1728395061728395) * dVar236 +
                                       dVar260 * 0.026329605555555555 * dVar310 +
                                       -(dVar263 * 0.010531842222222223) *
                                       dVar264 * dVar234 * dVar62 +
                                       -(dVar355 * 0.010531842222222223) * dVar312 +
                                       dVar263 * 0.028084912592592593 * dVar354 * dVar311 +
                                       -(dVar262 * 0.010531842222222223) * dVar266 +
                                       dVar263 * 0.01474457911111111 *
                                       dVar264 * dVar103 * dVar295 * dVar194 +
                                       local_2b58 * dVar63 +
                                       -(dVar309 * 0.07021228148148148) * dVar261 +
                                       local_2a70 * dVar232 * 0.43209876543209874 * dVar105 +
                                       local_2b40 * dVar101 * 0.43209876543209874 * dVar105 +
                            ((((-(dVar145 * 0.010531842222222223) * dVar266 +
                               -(dVar303 * 0.007310467860082304) * dVar27 * dVar265 +
                               local_2b70 * 1.8171205928321397 * dVar26 * 0.026329605555555555 *
                               dVar146 + dVar233 * 0.2419753086419753 * dVar357 * dVar152 +
                                         -(dVar145 * 0.07021228148148148) * dVar354 * dVar104 +
                                         local_2968 * 0.24 * dVar152 +
                                         -(dVar302 * dVar189 * 0.0487364524005487) * dVar105 +
                                         -(dVar233 * 0.1728395061728395) * dVar235 * dVar62 +
                                         dVar52 * -0.1728395061728395 * dVar304 +
                                         -(dVar7 * 0.1728395061728395 * dVar304)) -
                              (dVar204 * dVar62) / 5.0) - (local_2a58 * dVar203 * dVar194) / 5.0) -
                            (local_29e0 * dVar203 * dVar295) / 5.0)) +
                   -(dVar178 * 6.0) * dVar32 * local_29c0 +
                   dVar177 * dVar313 +
                   -(dVar178 * 6.0) * dVar179 * local_2b20 +
                   -(dVar29 * 12.0) * dVar289 +
                   -(dVar178 * 6.0) * dVar347 * local_2a38 +
                   dVar23 * 54.0 * dVar28 +
                   -(dVar176 * 6.0) * dVar293 +
                   dVar292 * dVar267 + dVar13 * dVar147 + -(dVar291 * 6.0 * dVar180) +
                   (dVar315 * dVar284) / 10.0 + (dVar269 * dVar321) / 10.0 +
                   (dVar279 * dVar321) / 10.0 + (dVar166 * dVar281 * dVar154) / 10.0) +
                  dVar13 * dVar25 + (dVar158 * dVar193) / 10.0 + (dVar150 * dVar294) / 10.0 +
                 (dVar231 * dVar154) / 10.0) + (dVar100 * -0.9847450218426964 * dVar324) / 8.0;
  }
  if ((in_stack_00000008[6] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xe];
    *(double *)(in_stack_00000008[6] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2b78 + local_2a90 * 2.0 +
         *(double *)(in_stack_00000008[6] + lVar5 * 8);
  }
  if (((in_stack_00000008[7] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x74);
    *(double *)(in_stack_00000008[7] + lVar5 * 8) =
         *(double *)(in_stack_00000008[7] + lVar5 * 8) + 0.0;
  }
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2b80 = (dVar174 * dVar325) / 8.0;
  }
  else {
    local_2b80 = 0.0;
  }
  dVar7 = dVar326 * local_29c0;
  dVar13 = (dVar15 * local_2b80 * 9.0 +
           dVar7 * 18.0 +
           local_29c0 * local_2a98 + local_29c0 * local_2a98 + local_2940 * local_2b80 * 2.0) *
           dVar19;
  dVar328 = dVar328 * dVar17;
  dVar28 = dVar18 * local_2a98 * local_29c0;
  dVar17 = dVar178 * dVar302 * dVar99;
  dVar52 = dVar104 * dVar15;
  dVar62 = dVar27 * dVar52 * local_29c0;
  dVar99 = dVar31 * 1.8171205928321397 * dVar26 * dVar104;
  dVar104 = (dVar328 * 6.0 * dVar175 +
            dVar15 * local_2b80 * 6.0 * dVar178 +
            dVar7 * 12.0 * dVar178 + dVar327 * 6.0 * dVar176 + -(dVar16 * 54.0 * dVar28)) - dVar13;
  dVar152 = dVar170 * 1.0814814814814815 * local_2b80 +
            dVar283 * 1.0814814814814815 * local_2a98 +
            dVar339 * 2.162962962962963 * local_29c0 +
            -(dVar169 * local_2b80 * 1.0814814814814815) * dVar171 +
            -(dVar282 * local_2a98 * 1.0814814814814815) * dVar171 +
            dVar337 * 0.27037037037037037 * dVar338 * local_29c0 +
            -(dVar337 * 0.27037037037037037 * dVar26 * local_29c0) * dVar171 +
            dVar320 * 0.4506172839506173 +
            dVar282 * 0.36049382716049383 * 1.5874010519681996 * dVar332 * dVar26 +
            -(dVar317 * 0.6008230452674898);
  dVar153 = dVar178 * dVar336;
  dVar154 = dVar334 * dVar281;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2b88 = 0.0;
  }
  else {
    local_2b88 = -(dVar10 * 0.36927938319101117) *
                 (-(dVar151 * 0.09) * dVar340 * dVar193 +
                  dVar104 * dVar173 +
                  dVar20 * dVar336 * 0.02515528987654321 * dVar27 * dVar265 +
                  dVar20 * 1.5874010519681996 * 0.10481370781893004 * dVar99 +
                  dVar153 * 0.37732934814814817 * dVar62 +
                  -(dVar177 * 1.5874010519681996 * 0.06288822469135802) * dVar333 +
                  -(dVar178 * 6.0) * dVar285 * local_2b80 +
                  -(dVar156 * 12.0) * dVar7 +
                  -(dVar178 * 6.0) * dVar98 * local_2a98 +
                  dVar155 * 54.0 * dVar28 +
                  -(dVar176 * 6.0) * dVar342 +
                  dVar329 * dVar191 +
                  -(dVar328 * 6.0) * dVar286 +
                  -(double)in_RDI[6] *
                  (-(dVar166 * 0.09) * dVar172 * dVar340 * dVar193 +
                   dVar334 * local_2a28 * dVar173 +
                   dVar104 * local_29b0 * dVar173 +
                   dVar331 * 0.02515528987654321 * dVar332 * dVar236 +
                   dVar331 * 0.10481370781893004 * dVar99 +
                   -(dVar20 * local_29f8 * 1.5874010519681996 * 0.06288822469135802) * dVar333 +
                   dVar17 * 0.37732934814814817 * dVar62 +
                   -(dVar177 * dVar302 * 0.06288822469135802) * dVar333 +
                   -(dVar178 * 6.0) * dVar179 * local_2b80 +
                   -(dVar29 * 12.0) * dVar7 +
                   -(dVar178 * 6.0) * dVar347 * local_2a98 +
                   dVar23 * 54.0 * dVar28 +
                   -(dVar176 * 6.0) * dVar330 +
                   dVar329 * dVar267 + dVar13 * dVar147 + -(dVar328 * 6.0 * dVar180) +
                   (dVar335 * dVar284) / 10.0 + (dVar269 * dVar341) / 10.0 +
                   (dVar279 * dVar341) / 10.0 + (dVar166 * dVar281 * dVar152) / 10.0) +
                  dVar13 * dVar25 + (dVar154 * dVar193) / 10.0 + (dVar150 * dVar340) / 10.0 +
                 (dVar231 * dVar152) / 10.0) + (dVar100 * -0.9847450218426964 * dVar343) / 8.0;
  }
  if (((in_stack_00000008[8] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0xf];
    *(double *)(in_stack_00000008[8] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2b88 + local_2aa0 * 2.0 +
         *(double *)(in_stack_00000008[8] + lVar5 * 8);
  }
  dVar7 = local_2a38 * local_2a38;
  dVar13 = (local_2940 * dVar7 * 18.0 + dVar7 + dVar7 + local_2940 * 0.0 * 2.0 + dVar15 * 0.0 * 9.0)
           * dVar19;
  local_2a48 = local_2a48 * local_2a48;
  dVar28 = dVar295 * dVar295;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_2b90 = 0.0;
  }
  else {
    local_2b90 = dVar185 * 0.006111111111111111 * dVar24 * local_2948 * dVar28 +
                 -(dVar22 * dVar1 * 1.4422495703074083 * ((1.0 / dVar30) / (dVar37 * dVar21)) *
                   5.977664547169544e-05 * dVar186 * local_2948 * dVar35 * 1.2599210498948732);
  }
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2b98 = local_2b90;
  }
  else {
    local_2b98 = 0.0;
  }
  local_2ba8 = ((((((((((((dVar45 * local_2a48) / 6.0 - (dVar182 * local_2b98) / 18.0) -
                        (dVar46 * local_2a48) / 48.0) + (dVar195 * local_2b98) / 240.0 +
                       (dVar48 * local_2a48) / 640.0) - (dVar196 * local_2b98) / 4480.0) -
                     (dVar49 * local_2a48) / 11520.0) + (dVar197 * local_2b98) / 103680.0 +
                    (dVar50 * local_2a48) / 258048.0) - (dVar198 * local_2b98) / 2838528.0) -
                  (dVar51 * local_2a48) / 6881280.0) + (dVar199 * local_2b98) / 89456640.0 +
                 (dVar53 * local_2a48) / 212336640.0) - (dVar44 * local_2b98) / 3185049600.0) -
               (dVar43 * local_2a48) / 7431782400.0) + (local_2958 * local_2b98) / 126340300800.0;
  if ((dVar42 != 0.0) || (NAN(dVar42))) {
    local_2ba0 = 0.0;
  }
  else {
    local_2ba0 = local_2b90;
  }
  dVar8 = local_2a50 * local_2a50;
  if ((dVar41 == 0.0) && (!NAN(dVar41))) {
    local_2ba8 = -(local_2960 * 2.6666666666666665) *
                 (local_2960 * 2.0 *
                  (-(dVar55 * local_2ba0) * dVar59 +
                  -(dVar200 * 4.0) * local_2ba0 +
                  -(dVar58 * dVar8) * dVar59 +
                  -(dVar8 * 4.0) * dVar60 +
                  dVar93 * -2.0 * dVar8 * dVar59 + (dVar181 * local_2ba0 * dVar59) / 2.0 +
                  (dVar57 * dVar8 * dVar59) / 4.0) +
                 local_2a50 * 4.0 * dVar297 +
                 local_2ba0 * 2.0 * dVar61 +
                 -dVar47 * local_2ba0 + dVar71 * 2.0 * dVar8 + (-(dVar40 * dVar8) * dVar59) / 2.0) +
                 local_2ba0 * -2.6666666666666665 * dVar56 +
                 -(local_2a50 * 5.333333333333333 * dVar298);
  }
  dVar8 = dVar34 * 1.2599210498948732 * dVar38;
  local_2a60 = local_2a60 * local_2a60;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2bb0 = local_2b90;
  }
  else {
    local_2bb0 = 0.0;
  }
  dVar21 = local_2a68 * local_2a68;
  if ((dVar65 != 0.0) || (NAN(dVar65))) {
    local_2bb8 = 0.0;
  }
  else {
    local_2bb8 = local_2b90;
  }
  dVar22 = dVar92 * 768.0 * dVar21;
  dVar30 = dVar224 * 256.0 * local_2bb8;
  if ((dVar64 != 0.0) || (NAN(dVar64))) {
    local_2bc0 = dVar77 * local_2a60 * -0.0036458333333333334 +
                 dVar76 * 0.026785714285714284 * local_2a60 +
                 dVar70 * local_2a60 * -6.156813072833613e-37 +
                 dVar72 * local_2a60 * -5.2947108149957596e-33 +
                 dVar78 * local_2a60 * 4.588885732696935e-31 +
                 ((dVar73 * local_2a60 * 2.9767152251494278e-27 +
                  ((dVar88 * local_2a60 * -1.0330674055506187e-21 +
                   (dVar89 * local_2a60) / 6.413496239867403e+22) -
                  (dVar90 * local_2a60) / 4.5123912079969836e+24)) -
                 (dVar91 * local_2a60) / 2.638135332978604e+28) +
                 (dVar75 * local_2a60) / 1.7135877778106135e+34 +
                 dVar74 * local_2a60 * 6.419508807886076e-20 +
                 ((dVar86 * local_2a60 * -9.963564958965524e-15 +
                   dVar84 * local_2a60 * -1.8676367771303596e-11 +
                   dVar83 * local_2a60 * 6.895252899056353e-10 +
                   ((dVar81 * local_2a60 * 6.297278025793651e-07 +
                    dVar79 * local_2a60 * 0.0002739448051948052 +
                    -(dVar80 * local_2a60 * 1.475575206043956e-05)) -
                   (dVar82 * local_2a60) / 44564480.0) + (dVar85 * local_2a60) / 2207210536960.0 +
                  (dVar87 * local_2a60) / 4.98616712036352e+15) -
                 (dVar69 * local_2a60) / 2.68538535215104e+17) +
                 ((((((((((dVar208 * local_2bb0) / 3.000772247138819e+22 -
                         (local_2970 * local_2bb0) / 2.116453759156243e+24) +
                        (dVar66 * local_2bb0) / 1.5793369227989443e+26) -
                       (dVar205 * local_2bb0) / 1.2429808430244664e+28) +
                      (dVar67 * local_2bb0) / 1.0288727798616555e+30) -
                     (dVar212 * local_2bb0) / 8.934630842486435e+31) +
                    (dVar68 * local_2bb0) / 8.121312287389663e+33) -
                   (dVar217 * local_2bb0) / 24654643200.0) +
                  (dVar218 * local_2bb0) / 1017328435200.0) -
                 (dVar219 * local_2bb0) / 46351421276160.0) +
                 (dVar220 * local_2bb0) / 2.308410703872e+15 +
                 ((((dVar213 * local_2bb0 * -3.0438311688311688e-05 +
                     -(dVar210 * 0.005357142857142857) * local_2bb0 +
                     ((-(dVar221 * local_2bb0) / 1.24654178009088e+17 +
                      (dVar222 * local_2bb0) / 7.250540450807808e+18) -
                     (dVar206 * local_2bb0) / 4.517479587281633e+20) +
                     (dVar209 * local_2bb0) / 7.633819549822504e+37 +
                     (dVar211 * local_2bb0) / 1920.0 + (dVar214 * local_2bb0) / 745472.0) -
                   (dVar215 * local_2bb0) / 20643840.0) + (dVar216 * local_2bb0) / 668467200.0) -
                 (dVar207 * local_2bb0) / 7.71114500014776e+35);
  }
  else {
    local_2bc0 = local_2bb8 * 48.0 * dVar223 +
                 dVar97 * 48.0 * dVar21 +
                 local_2a68 * 96.0 * dVar299 +
                 dVar92 * 24.0 *
                 (-(dVar230 * 10.0) * local_2bb8 +
                 -(dVar360 * 5.0 * dVar21) * dVar95 +
                 local_2bb8 * 10.0 * dVar54 * dVar96 +
                 local_2978 * local_2bb8 * -72.0 +
                 dVar21 * -72.0 +
                 -(dVar361 * 1.5) * dVar21 * dVar95 +
                 (((dVar21 * 40.0 + local_2978 * local_2bb8 * 40.0) - dVar22) - dVar30) * dVar95 +
                 dVar300 * dVar301 + (dVar228 * local_2bb8 * dVar95) / 2.0 +
                 (dVar94 * dVar21 * dVar95) / 4.0 + dVar22 + dVar30);
  }
  local_2a78 = local_2a78 * local_2a78;
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2bc8 = local_2b90;
  }
  else {
    local_2bc8 = 0.0;
  }
  if ((dVar107 != 0.0) || (NAN(dVar107))) {
    local_2bd0 = 0.0;
  }
  else {
    local_2bd0 = local_2b90;
  }
  dVar21 = local_2a80 * local_2a80;
  dVar22 = dVar21 * dVar138;
  if ((dVar106 != 0.0) || (NAN(dVar106))) {
    local_2bd8 = ((((((((((((((dVar114 * local_2a78 * 4.22754329004329e-05 +
                              ((dVar111 * 0.007653061224489796 * local_2a78 +
                               ((dVar110 * local_2a78) / 1.6551271225536316e+28 -
                               (dVar112 * local_2a78) / 1.4198444362090846e+30)) -
                              (dVar113 * local_2a78) / 1344.0)) - (dVar115 * local_2a78) / 559104.0)
                            + (dVar116 * local_2a78) / 16220160.0) -
                           (dVar118 * local_2a78) / 551485440.0) +
                          (dVar119 * local_2a78) / 21367357440.0) -
                         (dVar120 * local_2a78) / 925768876032.0) +
                        (dVar121 * local_2a78) / 44244538490880.0) -
                       (dVar122 * local_2a78) / 2.308410703872e+15) +
                      (dVar123 * local_2a78) / 1.304074477633536e+17) -
                     (dVar124 * local_2a78) / 7.923804921239962e+18) +
                    (dVar125 * local_2a78) / 5.149926729501062e+20) -
                   (dVar127 * local_2a78) / 3.5634170434773477e+22) +
                  (dVar128 * local_2a78) / 2.614442878957712e+24) -
                 (dVar129 * local_2a78) / 2.0268157175919785e+26) +
                 -(dVar238 * 0.001530612244897959) * local_2bc8 +
                 ((((((dVar240 * local_2bc8 * -4.6972703222703225e-06 +
                       ((((((-(dVar237 * local_2bc8) / 6.123970353448437e+29 +
                             (dVar109 * local_2bc8) / 5.53739330121543e+31 +
                            (dVar247 * local_2bc8) / 5.3093446189056e+16) -
                           (dVar248 * local_2bc8) / 3.26018619408384e+18) +
                          (dVar249 * local_2bc8) / 2.1394273287347896e+20) -
                         (dVar250 * local_2bc8) / 1.493478751555308e+22) +
                        (dVar117 * local_2bc8) / 1.1046592834779778e+24) -
                       (local_2988 * local_2bc8) / 8.627661500560449e+25) +
                       (dVar108 * local_2bc8) / 7.093855011571925e+27 +
                      (dVar241 * local_2bc8) / 6150144.0) - (dVar242 * local_2bc8) / 210862080.0) +
                    (dVar243 * local_2bc8) / 8272281600.0) - (dVar244 * local_2bc8) / 363245076480.0
                   ) + (dVar245 * local_2bc8) / 17589608644608.0) -
                 (dVar246 * local_2bc8) / 929135308308480.0) + (dVar239 * local_2bc8) / 9408.0;
  }
  else {
    local_2bd8 = local_2990 * 1.1428571428571428 *
                 (-(dVar258 * 2.0) * dVar137 * local_2bd0 +
                 dVar258 * 4.0 * dVar252 * dVar21 +
                 -dVar141 * dVar22 +
                 -(dVar142 * 480.0 * dVar21) * dVar138 +
                 dVar257 * 240.0 * local_2bd0 * dVar143 +
                 dVar54 * 240.0 * dVar21 * dVar143 +
                 dVar131 * 24.0 *
                 (dVar133 * local_2bd0 * 30720.0 +
                 dVar132 * dVar21 * 153600.0 +
                 dVar131 * local_2bd0 * -5760.0 +
                 dVar130 * dVar21 * -17280.0 + dVar21 * 448.0 + local_2990 * local_2bd0 * 448.0) +
                 dVar255 * 72.0 * local_2bd0 +
                 dVar307 * 144.0 * local_2a80 +
                 dVar140 * 144.0 * dVar21 +
                 -(dVar126 * 1.5) * dVar22 +
                 (dVar139 * local_2bd0 * 26880.0 +
                 dVar133 * dVar21 * 161280.0 +
                 dVar132 * local_2bd0 * -2880.0 +
                 dVar131 * dVar21 * -11520.0 +
                 dVar130 * local_2bd0 * 768.0 +
                 local_2990 * dVar21 * 1536.0 +
                 local_2bd0 * -8.0 +
                 dVar134 * -8847360.0 * dVar21 + -(dVar135 * 1105920.0 * local_2bd0)) * dVar138 +
                 dVar305 * dVar306 + (dVar253 * local_2bd0 * dVar138) / 2.0 +
                 (dVar136 * dVar22) / 4.0) +
                 local_2bd0 * 1.1428571428571428 * dVar144 +
                 local_2a80 * 2.2857142857142856 * dVar308;
  }
  dVar21 = ((local_2940 * dVar7 * 12.0 * dVar178 +
            dVar16 * -54.0 * dVar18 * dVar7 + dVar291 * 12.0 * dVar290) - dVar13) +
           dVar178 * 6.0 * dVar15 * 0.0;
  dVar22 = dVar169 * 2.162962962962963 * dVar7 +
           ((dVar318 * dVar319 * local_2a38 * -0.007510288065843622 +
            dVar35 * dVar38 * 1.2599210498948732 * 0.004797763298277701 +
            dVar318 * dVar31 * local_2a38 * dVar171 * 0.007510288065843622) -
           dVar169 * 0.0 * 1.0814814814814815 * dVar171) + dVar170 * 1.0814814814814815 * 0.0;
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2be0 = 0.0;
  }
  else {
    local_2be0 = dVar10 * -0.36927938319101117 *
                 (-(dVar151 * 0.09) * dVar294 * dVar294 +
                  dVar21 * dVar173 +
                  dVar20 * (-(dVar190 * 3.3019272488946267 * 0.0033474921464149445) * dVar8 +
                           dVar33 * 0.43555555555555553 * dVar28 +
                           -(dVar318 * 0.035684620164609056 * dVar31 * dVar234) * dVar295 +
                           dVar39 * 0.24 * dVar28 +
                           -(dVar203 * 3.3019272488946267 * 0.0021519592369810357 * dVar8)) +
                  ((-(dVar178 * 12.0) * dVar149 * dVar7 +
                   -(dVar178 * 12.0) * dVar157 * local_2a38 +
                   dVar16 * 54.0 * dVar36 * dVar7 +
                   dVar292 * 2.0 * dVar323 +
                   -(dVar291 * 12.0) * dVar322 +
                   -(double)in_RDI[6] *
                   (-(dVar166 * 0.09) * dVar172 * dVar294 * dVar294 +
                    dVar21 * local_29b0 * dVar173 +
                    dVar20 * (-(local_2998 * *in_RCX * 1.3960151919265937e-05) *
                              (1.0 / (dVar37 * dVar37)) * dVar234 +
                             dVar263 * 0.01474457911111111 * dVar264 * dVar103 * dVar28 +
                             -(dVar145 * 0.021063684444444446) * dVar312 +
                             -(dVar262 * 0.021063684444444446) * dVar312 +
                             dVar309 * 0.05265921111111111 * dVar310 +
                             local_2bd8 * 1.8171205928321397 * dVar26 * 0.026329605555555555 *
                             dVar146 + -(dVar102 * 0.00011455098324263666) *
                                       dVar234 * 1.2599210498948732 * dVar38 +
                                       dVar233 * 0.2419753086419753 * dVar357 * dVar28 +
                                       -(dVar303 * 0.014620935720164608) * dVar27 * dVar311 +
                                       -(dVar148 * 0.345679012345679) * dVar304 +
                                       local_2a70 * 1.5874010519681996 * dVar31 *
                                       0.036552339300411525 * dVar105 +
                                       local_2bc0 * dVar101 * 0.43209876543209874 * dVar105 +
                                       -(dVar204 * 3.3019272488946267 * 0.0021519592369810357) *
                                       dVar8 + local_2968 * 0.24 * dVar28 +
                                               local_2ba8 * dVar63 +
                                               -(local_2a58 * dVar203 * 0.4 * dVar295)) +
                    ((-(dVar178 * 12.0) * dVar348 * dVar7 +
                     -(dVar178 * 12.0) * dVar32 * local_2a38 +
                     dVar16 * 54.0 * dVar346 * dVar7 +
                     dVar292 * 2.0 * dVar313 + dVar13 * dVar147 + -(dVar291 * 12.0 * dVar293)) -
                    dVar178 * 6.0 * dVar179 * 0.0) + (dVar315 * dVar321) / 5.0 +
                   (dVar166 * dVar281 * dVar22) / 10.0) + dVar13 * dVar25) -
                  dVar178 * 6.0 * dVar285 * 0.0) + (dVar158 * dVar294) / 5.0 +
                 (dVar231 * dVar22) / 10.0);
  }
  if ((in_stack_00000008[9] != 0) && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x7c);
    *(double *)(in_stack_00000008[9] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2be0 + *(double *)(in_stack_00000008[9] + lVar5 * 8);
  }
  if (((in_stack_00000008[10] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0x10];
    *(double *)(in_stack_00000008[10] + lVar5 * 8) =
         *(double *)(in_stack_00000008[10] + lVar5 * 8) + 0.0;
  }
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2be8 = (-dVar11 * dVar325) / 8.0;
  }
  else {
    local_2be8 = 0.0;
  }
  dVar326 = dVar326 * local_2a38;
  dVar7 = (dVar15 * local_2be8 * 9.0 +
          dVar326 * 18.0 +
          local_2a38 * local_2a98 + local_2a38 * local_2a98 + local_2940 * local_2be8 * 2.0) *
          dVar19;
  dVar8 = dVar18 * local_2a98 * local_2a38;
  dVar11 = dVar27 * dVar52 * local_2a38;
  dVar13 = (dVar15 * local_2be8 * 6.0 * dVar178 +
           dVar326 * 12.0 * dVar178 +
           dVar328 * 6.0 * dVar290 + dVar327 * 6.0 * dVar291 + -(dVar16 * 54.0 * dVar8)) - dVar7;
  dVar21 = dVar170 * 1.0814814814814815 * local_2be8 +
           dVar318 * dVar319 * local_2a98 * -0.003755144032921811 +
           dVar339 * 2.162962962962963 * local_2a38 +
           -(dVar169 * local_2be8 * 1.0814814814814815) * dVar171 +
           dVar318 * dVar31 * local_2a98 * dVar171 * 0.003755144032921811 +
           dVar337 * 0.27037037037037037 * dVar338 * local_2a38 +
           dVar35 * 1.2599210498948732 * ((1.0 / dVar9) / dVar37) * -0.002503429355281207 +
           -(dVar337 * 0.27037037037037037 * dVar26 * local_2a38 * dVar171);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2bf0 = 0.0;
  }
  else {
    local_2bf0 = dVar10 * -0.36927938319101117 *
                 (-(dVar151 * 0.09) * dVar340 * dVar294 +
                  dVar13 * dVar173 +
                  dVar20 * dVar336 * 0.02515528987654321 * dVar27 * dVar311 +
                  dVar153 * 0.37732934814814817 * dVar11 +
                  -(dVar292 * 1.5874010519681996 * 0.06288822469135802) * dVar333 +
                  -(dVar178 * 6.0) * dVar285 * local_2be8 +
                  -(dVar156 * 12.0) * dVar326 +
                  -(dVar178 * 6.0) * dVar157 * local_2a98 +
                  dVar155 * 54.0 * dVar8 +
                  -(dVar291 * 6.0) * dVar342 +
                  dVar329 * dVar323 +
                  -(dVar328 * 6.0) * dVar322 +
                  -(double)in_RDI[6] *
                  (-(dVar166 * 0.09) * dVar172 * dVar340 * dVar294 +
                   dVar13 * local_29b0 * dVar173 +
                   dVar331 * 0.02515528987654321 * dVar332 * dVar304 +
                   -(dVar20 * local_2a70 * 1.5874010519681996 * 0.06288822469135802) * dVar333 +
                   dVar17 * 0.37732934814814817 * dVar11 +
                   -(dVar292 * dVar302 * 0.06288822469135802) * dVar333 +
                   -(dVar178 * 6.0) * dVar179 * local_2be8 +
                   -(dVar29 * 12.0) * dVar326 +
                   -(dVar178 * 6.0) * dVar32 * local_2a98 +
                   dVar23 * 54.0 * dVar8 +
                   -(dVar291 * 6.0) * dVar330 +
                   dVar329 * dVar313 + dVar7 * dVar147 + -(dVar328 * 6.0 * dVar293) +
                   (dVar335 * dVar321) / 10.0 + (dVar315 * dVar341) / 10.0 +
                  (dVar166 * dVar281 * dVar21) / 10.0) + dVar7 * dVar25 + (dVar154 * dVar294) / 10.0
                  + (dVar158 * dVar340) / 10.0 + (dVar231 * dVar21) / 10.0);
  }
  if (((in_stack_00000008[0xb] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x84);
    *(double *)(in_stack_00000008[0xb] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2bf0 + *(double *)(in_stack_00000008[0xb] + lVar5 * 8);
  }
  if (((in_stack_00000008[0xc] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0x11];
    *(double *)(in_stack_00000008[0xc] + lVar5 * 8) =
         *(double *)(in_stack_00000008[0xc] + lVar5 * 8) + 0.0;
  }
  if (((in_stack_00000008[0xd] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x8000) != 0)) &&
     (((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0 && ((*(uint *)(*in_RDI + 0x40) & 4) != 0)))) {
    lVar5 = in_RSI * *(int *)((long)in_RDI + 0x8c);
    *(double *)(in_stack_00000008[0xd] + lVar5 * 8) =
         *(double *)(in_stack_00000008[0xd] + lVar5 * 8) + 0.0;
  }
  dVar7 = local_2a98 * local_2a98;
  if ((dVar14 != 0.0) || (NAN(dVar14))) {
    local_2bf8 = (dVar12 * ((1.0 / (dVar3 * dVar4)) / *in_R9)) / 4.0;
  }
  else {
    local_2bf8 = 0.0;
  }
  dVar19 = (dVar15 * local_2bf8 * 9.0 +
           local_2940 * dVar7 * 18.0 + dVar7 + dVar7 + local_2940 * local_2bf8 * 2.0) * dVar19;
  dVar8 = dVar27 * dVar52 * local_2a98;
  dVar11 = (dVar15 * local_2bf8 * 6.0 * dVar178 +
           local_2940 * dVar7 * 12.0 * dVar178 +
           dVar327 * 12.0 * dVar328 + -(dVar16 * 54.0 * dVar18 * dVar7)) - dVar19;
  dVar9 = dVar170 * 1.0814814814814815 * local_2bf8 +
          dVar169 * 2.162962962962963 * dVar7 +
          -(dVar169 * local_2bf8 * 1.0814814814814815) * dVar171 +
          dVar337 * 0.5407407407407407 * dVar338 * local_2a98 +
          ((1.0 / dVar9) / dVar188) * 0.22709688059833516 * dVar35 +
          -(dVar337 * 0.5407407407407407 * dVar26 * local_2a98 * dVar171);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    local_2c00 = 0.0;
  }
  else {
    local_2c00 = dVar10 * -0.36927938319101117 *
                 (-(dVar151 * 0.09) * dVar340 * dVar340 +
                  dVar11 * dVar173 +
                  -(dVar178 * 6.0) * dVar285 * local_2bf8 +
                  -(dVar178 * 12.0) * dVar149 * dVar7 +
                  dVar153 * 0.7546586962962963 * dVar8 +
                  dVar16 * 54.0 * dVar36 * dVar7 +
                  -(dVar329 * 1.5874010519681996 * 0.12577644938271604) * dVar333 +
                  -(dVar328 * 12.0) * dVar342 +
                  -(double)in_RDI[6] *
                  (-(dVar166 * 0.09) * dVar172 * dVar340 * dVar340 +
                   dVar11 * local_29b0 * dVar173 +
                   -(dVar178 * 6.0) * dVar179 * local_2bf8 +
                   -(dVar178 * 12.0) * dVar348 * dVar7 +
                   dVar17 * 0.7546586962962963 * dVar8 +
                   dVar16 * 54.0 * dVar346 * dVar7 +
                   -(dVar329 * dVar302 * 0.12577644938271604) * dVar333 +
                   dVar19 * dVar147 + -(dVar328 * 12.0 * dVar330) + (dVar335 * dVar341) / 5.0 +
                  (dVar166 * dVar281 * dVar9) / 10.0) + dVar19 * dVar25 + (dVar154 * dVar340) / 5.0
                 + (dVar231 * dVar9) / 10.0);
  }
  if (((in_stack_00000008[0xe] != 0) && ((*(uint *)(*in_RDI + 0x40) & 0x10000) != 0)) &&
     ((*(uint *)(*in_RDI + 0x40) & 4) != 0)) {
    lVar5 = in_RSI * (int)in_RDI[0x12];
    *(double *)(in_stack_00000008[0xe] + lVar5 * 8) =
         *in_RDX * 2.0 * local_2c00 + *(double *)(in_stack_00000008[0xe] + lVar5 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_fxc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t2, t3, t4, t5, t7, t8, t9, t11;
  double t12, t14, t15, t17, t18, t20, t21, t22;
  double t24, t25, t26, t27, t29, t32, t33, t35;
  double t39, t41, t42, t43, t44, t47, t51, tzk0;

  double t52, t57, t58, t60, t64, t67, t69, t74;
  double tvrho0, t80, t83, t88, tvsigma0;

  double t99, t101, t105, t108, t114, tv2rho20, t125, t131;
  double tv2rhosigma0, t134, t136, t140, t143, tv2sigma20;


  t2 = rho[0] / 0.2e1 <= p->dens_threshold;
  t3 = M_CBRT3;
  t4 = t3 * t3;
  t5 = M_CBRTPI;
  t7 = t4 * t5 * M_PI;
  t8 = 0.1e1 <= p->zeta_threshold;
  t9 = p->zeta_threshold - 0.1e1;
  t11 = my_piecewise5(t8, t9, t8, -t9, 0);
  t12 = 0.1e1 + t11;
  t14 = POW_1_3(p->zeta_threshold);
  t15 = t14 * t14;
  t17 = POW_1_3(t12);
  t18 = t17 * t17;
  t20 = my_piecewise3(t12 <= p->zeta_threshold, t15 * p->zeta_threshold, t18 * t12);
  t21 = POW_1_3(rho[0]);
  t22 = t21 * t21;
  t24 = M_CBRT2;
  t25 = t24 * t24;
  t26 = sigma[0] * t25;
  t27 = rho[0] * rho[0];
  t29 = 0.1e1 / t22 / t27;
  t32 = sqrt(sigma[0]);
  t33 = t25 * t32;
  t35 = 0.1e1 / t21 / rho[0];
  t39 = M_CBRT6;
  t41 = M_PI * M_PI;
  t42 = POW_1_3(t41);
  t43 = t42 * t42;
  t44 = 0.1e1 / t43;
  t47 = 0.1e1 + 0.5e1 / 0.9e1 * (t26 * t29 / 0.72e2 + 0.677e-2 * t33 * t35) * t39 * t44;
  t51 = my_piecewise3(t2, 0, 0.3e1 / 0.2e2 * t7 * t20 * t22 * t47);
  tzk0 = 0.2e1 * t51;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

  t52 = 0.1e1 / t21;
  t57 = t7 * t20;
  t58 = t27 * rho[0];
  t60 = 0.1e1 / t22 / t58;
  t64 = 0.1e1 / t21 / t27;
  t67 = -t26 * t60 / 0.27e2 - 0.90266666666666666666e-2 * t33 * t64;
  t69 = t39 * t44;
  t74 = my_piecewise3(t2, 0, t7 * t20 * t52 * t47 / 0.1e2 + t57 * t22 * t67 * t69 / 0.12e2);
  tvrho0 = 0.2e1 * rho[0] * t74 + 0.2e1 * t51;

  if(out->vrho != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vrho[ip*p->dim.vrho + 0] += tvrho0;

  t80 = t25 / t32;
  t83 = t25 * t29 / 0.72e2 + 0.3385e-2 * t80 * t35;
  t88 = my_piecewise3(t2, 0, t57 * t22 * t83 * t69 / 0.12e2);
  tvsigma0 = 0.2e1 * rho[0] * t88;

  if(out->vsigma != NULL && (p->info->flags & XC_FLAGS_HAVE_VXC))
    out->vsigma[ip*p->dim.vsigma + 0] += tvsigma0;

  t99 = t27 * t27;
  t101 = 0.1e1 / t22 / t99;
  t105 = 0.1e1 / t21 / t58;
  t108 = 0.11e2 / 0.81e2 * t26 * t101 + 0.21062222222222222222e-1 * t33 * t105;
  t114 = my_piecewise3(t2, 0, -t7 * t20 * t35 * t47 / 0.3e2 + t57 * t52 * t67 * t69 / 0.9e1 + t57 * t22 * t108 * t69 / 0.12e2);
  tv2rho20 = 0.2e1 * rho[0] * t114 + 0.4e1 * t74;

  if(out->v2rho2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rho2[ip*p->dim.v2rho2 + 0] += tv2rho20;

  t125 = -t25 * t60 / 0.27e2 - 0.45133333333333333333e-2 * t80 * t64;
  t131 = my_piecewise3(t2, 0, t57 * t52 * t83 * t69 / 0.18e2 + t57 * t22 * t125 * t69 / 0.12e2);
  tv2rhosigma0 = 0.2e1 * rho[0] * t131 + 0.2e1 * t88;

  if(out->v2rhosigma != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2rhosigma[ip*p->dim.v2rhosigma + 0] += tv2rhosigma0;

  t134 = t4 * t20;
  t136 = t134 / t22;
  t140 = t25 / t32 / sigma[0] * t69;
  t143 = my_piecewise3(t2, 0, -0.64895402177010868827e-3 * t136 * t140);
  tv2sigma20 = 0.2e1 * rho[0] * t143;

  if(out->v2sigma2 != NULL && (p->info->flags & XC_FLAGS_HAVE_FXC))
    out->v2sigma2[ip*p->dim.v2sigma2 + 0] += tv2sigma20;

}